

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx2::forward_fp16
          (InnerProduct_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  ulong uVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [24];
  undefined8 uVar21;
  undefined4 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  void *pvVar27;
  uint uVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [32];
  _func_int *p_Var31;
  undefined1 (*pauVar32) [16];
  void *pvVar33;
  uint uVar34;
  int iVar35;
  void *pvVar36;
  long lVar37;
  void *pvVar38;
  void *pvVar39;
  void *pvVar40;
  void *pvVar41;
  ulong uVar42;
  void *pvVar43;
  undefined1 (*pauVar44) [16];
  void *pvVar45;
  undefined1 (*pauVar46) [16];
  uint uVar47;
  int iVar48;
  ulong uVar49;
  void *pvVar50;
  undefined1 (*pauVar51) [16];
  ulong uVar52;
  ulong uVar53;
  float fVar54;
  float fVar64;
  float fVar65;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  float fVar66;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar100;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float afVar181 [8];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined4 auStack_2a8 [26];
  undefined8 uStack_240;
  ulong local_230;
  int local_224;
  InnerProduct_x86_avx2 *local_220;
  ulong local_218;
  _func_int **local_210;
  void *local_208;
  void *local_200;
  long local_1f8;
  long local_1f0;
  undefined1 local_1e8 [32];
  float _m_f [8];
  ulong local_1a8;
  long local_1a0;
  ulong local_198;
  _func_int *local_190;
  ulong local_188;
  void *local_180;
  void *local_178;
  void *local_170;
  void *local_168;
  void *local_160;
  void *local_158;
  long local_150;
  Option opt_flatten;
  undefined4 local_108 [4];
  undefined2 auStack_f8 [8];
  undefined2 local_e8 [8];
  undefined2 auStack_d8 [12];
  Mat bottom_blob_flattened;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar58 [32];
  
  uStack_240 = 0x1c71fe;
  Mat::Mat(&bottom_blob_flattened,bottom_blob);
  if (bottom_blob->dims != 1) {
    auVar20[0] = opt->lightmode;
    auVar20._1_3_ = *(undefined3 *)&opt->field_0x1;
    auVar20._4_4_ = opt->num_threads;
    auVar20._8_8_ = opt->blob_allocator;
    auVar20._16_8_ = opt->workspace_allocator;
    uVar21 = opt->workspace_allocator;
    uVar22 = opt->openmp_blocktime;
    uVar23 = opt->use_winograd_convolution;
    uVar24 = opt->use_sgemm_convolution;
    uVar25 = opt->use_int8_inference;
    uVar26 = opt->use_vulkan_compute;
    opt_flatten.use_vulkan_compute = (bool)uVar26;
    opt_flatten.use_int8_inference = (bool)uVar25;
    opt_flatten.use_sgemm_convolution = (bool)uVar24;
    opt_flatten.use_winograd_convolution = (bool)uVar23;
    opt_flatten.openmp_blocktime = uVar22;
    opt_flatten.workspace_allocator = (Allocator *)uVar21;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_basic = opt->use_subgroup_basic;
    opt_flatten.use_subgroup_vote = opt->use_subgroup_vote;
    opt_flatten.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_flatten.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_reserved_1 = opt->use_reserved_1;
    opt_flatten.use_reserved_2 = opt->use_reserved_2;
    opt_flatten.use_reserved_3 = opt->use_reserved_3;
    opt_flatten.use_reserved_4 = opt->use_reserved_4;
    opt_flatten.use_reserved_5 = opt->use_reserved_5;
    opt_flatten.use_reserved_6 = opt->use_reserved_6;
    opt_flatten.use_reserved_7 = opt->use_reserved_7;
    opt_flatten.use_reserved_8 = opt->use_reserved_8;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten._0_8_ = auVar20._0_8_;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    uStack_240 = 0x1c7242;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&bottom_blob_flattened);
  }
  bottom_blob_flattened.w = bottom_blob_flattened.w * bottom_blob_flattened.elempack;
  bottom_blob_flattened.cstep = (size_t)bottom_blob_flattened.w;
  bottom_blob_flattened.elemsize = 4;
  bottom_blob_flattened.elempack = 1;
  uVar47 = bottom_blob_flattened.w * bottom_blob_flattened.h;
  uStack_240 = 0x1c72a0;
  Mat::create(top_blob,*(int *)(this->_vptr_InnerProduct_x86_avx2[-3] + 0x28 +
                               (long)&(this->weight_data_int8).data),4,opt->blob_allocator);
  local_208 = top_blob->data;
  iVar48 = -100;
  if ((local_208 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_210 = this->_vptr_InnerProduct_x86_avx2;
    local_1a8 = (ulong)*(int *)(local_210[-3] + 0x28 + (long)&(this->weight_data_int8).data);
    uVar34 = *(int *)(local_210[-3] + 0x28 + (long)&(this->weight_data_int8).data) >> 3;
    local_224 = (int)uVar47 >> 3;
    local_1f0 = (long)(int)uVar47;
    uVar47 = uVar47 & 7;
    uVar49 = (ulong)uVar47;
    uVar53 = 0;
    local_198 = (ulong)uVar34;
    if ((int)uVar34 < 1) {
      local_198 = uVar53;
    }
    local_200 = (this->weight_data_fp16).data;
    pvVar38 = (void *)(local_1f0 * 0xe + (long)local_200);
    local_1a0 = local_1f0 << 4;
    pvVar41 = (void *)(local_1f0 * 0xc + (long)local_200);
    pvVar43 = (void *)(local_1f0 * 10 + (long)local_200);
    pvVar45 = (void *)(local_1f0 * 8 + (long)local_200);
    pvVar36 = (void *)(local_1f0 * 6 + (long)local_200);
    local_150 = -uVar49;
    pvVar27 = (void *)(local_1f0 * 4 + (long)local_200);
    pvVar33 = (void *)((long)local_200 + local_1f0 * 2);
    pvVar39 = pvVar38;
    uVar52 = 0;
    pvVar50 = local_200;
    local_180 = pvVar33;
    local_178 = pvVar27;
    local_170 = pvVar36;
    local_168 = pvVar45;
    local_160 = pvVar43;
    local_158 = pvVar41;
    while (uVar29 = uVar52, auVar88 = local_1e8, p_Var31 = local_210[-3], uVar29 != local_198) {
      local_1f8 = uVar29 * 8;
      auVar55 = ZEXT816(0) << 0x40;
      auVar88 = ZEXT1632(auVar55);
      if (*(int *)(p_Var31 + 0x2c + (long)&(this->weight_data_int8).data) != 0) {
        auVar88 = *(undefined1 (*) [32])
                   (*(long *)(&this->field_0x178 + (long)p_Var31) + uVar29 * 0x20);
      }
      lVar37 = 0;
      auVar68 = ZEXT816(0) << 0x40;
      auVar57 = ZEXT816(0) << 0x40;
      auVar56 = ZEXT816(0) << 0x40;
      auVar67 = ZEXT816(0) << 0x40;
      auVar86 = ZEXT816(0) << 0x40;
      auVar173 = ZEXT816(0) << 0x40;
      auVar182 = ZEXT816(0) << 0x40;
      pvVar40 = bottom_blob_flattened.data;
      uVar52 = uVar53;
      iVar48 = local_224;
      while( true ) {
        local_1e8 = ZEXT1632(auVar55);
        auVar116 = ZEXT1632(auVar67);
        auVar113 = ZEXT1632(auVar56);
        if (iVar48 < 1) break;
        auVar58 = *(undefined1 (*) [32])((long)bottom_blob_flattened.data + lVar37 * 2);
        auVar55 = vlddqu_avx(*(undefined1 (*) [16])(lVar37 + (long)pvVar50));
        auVar56 = vlddqu_avx(*(undefined1 (*) [16])(lVar37 + (long)pvVar33));
        auVar67 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar27 + lVar37));
        auVar4 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar36 + lVar37));
        auVar5 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar45 + lVar37));
        auVar6 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar43 + lVar37));
        auVar7 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar41 + lVar37));
        auVar8 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar39 + lVar37));
        auVar10 = vcvtph2ps_f16c(auVar55);
        auVar55 = vfmadd231ps_fma(local_1e8,auVar58,auVar10);
        auVar10 = vcvtph2ps_f16c(auVar56);
        auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar58,auVar10);
        auVar10 = vcvtph2ps_f16c(auVar67);
        auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar58,auVar10);
        auVar10 = vcvtph2ps_f16c(auVar4);
        auVar56 = vfmadd231ps_fma(auVar113,auVar58,auVar10);
        auVar113 = vcvtph2ps_f16c(auVar5);
        auVar67 = vfmadd231ps_fma(auVar116,auVar58,auVar113);
        auVar113 = vcvtph2ps_f16c(auVar6);
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar58,auVar113);
        auVar113 = vcvtph2ps_f16c(auVar7);
        auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar58,auVar113);
        auVar113 = vcvtph2ps_f16c(auVar8);
        auVar182 = vfmadd231ps_fma(ZEXT1632(auVar182),auVar58,auVar113);
        pvVar40 = (void *)((long)pvVar40 + 0x20);
        iVar48 = iVar48 + -1;
        lVar37 = lVar37 + 0x10;
        uVar52 = uVar52 + 0x10;
      }
      auVar58 = local_1e8;
      local_190 = p_Var31;
      local_188 = uVar53;
      if (uVar47 != 0) {
        auVar55 = ZEXT816(0) << 0x40;
        _m_f = (float  [8])ZEXT1632(auVar55);
        opt_flatten._0_32_ = _m_f;
        opt_flatten._32_32_ = _m_f;
        for (lVar37 = 0x38; local_150 + lVar37 != 0x38; lVar37 = lVar37 + 1) {
          auStack_2a8[lVar37] = *(undefined4 *)((long)pvVar40 + lVar37 * 4 + -0xe0);
          *(undefined2 *)((long)_m_f + lVar37 * 2 + 0x10) =
               *(undefined2 *)((long)local_200 + uVar52);
          *(undefined2 *)((long)&local_1a8 + lVar37 * 2) = *(undefined2 *)((long)local_180 + uVar52)
          ;
          *(undefined2 *)((long)&local_198 + lVar37 * 2) = *(undefined2 *)((long)local_178 + uVar52)
          ;
          *(undefined2 *)((long)&local_188 + lVar37 * 2) = *(undefined2 *)((long)local_170 + uVar52)
          ;
          *(undefined2 *)((long)&local_178 + lVar37 * 2) = *(undefined2 *)((long)local_168 + uVar52)
          ;
          *(undefined2 *)((long)&local_168 + lVar37 * 2) = *(undefined2 *)((long)local_160 + uVar52)
          ;
          *(undefined2 *)((long)&local_158 + lVar37 * 2) = *(undefined2 *)((long)local_158 + uVar52)
          ;
          *(undefined2 *)((long)local_108 + (lVar37 + -0x20) * 2) =
               *(undefined2 *)((long)pvVar38 + uVar52);
          uVar52 = uVar52 + 2;
        }
        auVar56 = vlddqu_avx((undefined1  [16])opt_flatten._0_16_);
        auVar58 = vcvtph2ps_f16c(auVar56);
        auVar67 = vfmadd231ps_fma(local_1e8,(undefined1  [32])_m_f,auVar58);
        auVar56 = vlddqu_avx((undefined1  [16])opt_flatten._16_16_);
        auVar58 = vcvtph2ps_f16c(auVar56);
        auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),(undefined1  [32])_m_f,auVar58);
        auVar56 = vlddqu_avx((undefined1  [16])opt_flatten._32_16_);
        auVar58 = vcvtph2ps_f16c(auVar56);
        auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),(undefined1  [32])_m_f,auVar58);
        auVar56 = vlddqu_avx((undefined1  [16])opt_flatten._48_16_);
        auVar58 = vcvtph2ps_f16c(auVar56);
        auVar56 = vfmadd231ps_fma(auVar113,(undefined1  [32])_m_f,auVar58);
        auVar113 = ZEXT1632(auVar56);
        auVar56 = vlddqu_avx(auVar55);
        auVar58 = vcvtph2ps_f16c(auVar56);
        auVar56 = vfmadd231ps_fma(auVar116,(undefined1  [32])_m_f,auVar58);
        auVar116 = ZEXT1632(auVar56);
        auVar56 = vlddqu_avx((undefined1  [16])0x0);
        auVar58 = vcvtph2ps_f16c(auVar56);
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),(undefined1  [32])_m_f,auVar58);
        auVar55 = vlddqu_avx(auVar55);
        auVar58 = vcvtph2ps_f16c(auVar55);
        auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),(undefined1  [32])_m_f,auVar58);
        auVar55 = vlddqu_avx((undefined1  [16])0x0);
        auVar58 = vcvtph2ps_f16c(auVar55);
        auVar182 = vfmadd231ps_fma(ZEXT1632(auVar182),(undefined1  [32])_m_f,auVar58);
        p_Var31 = local_210[-3];
        auVar58 = ZEXT1632(auVar67);
      }
      auVar10 = vhaddps_avx(ZEXT1632(auVar173),ZEXT1632(auVar182));
      auVar116 = vhaddps_avx(auVar116,ZEXT1632(auVar86));
      auVar116 = vhaddps_avx(auVar116,auVar10);
      auVar113 = vhaddps_avx(ZEXT1632(auVar57),auVar113);
      auVar58 = vhaddps_avx(auVar58,ZEXT1632(auVar68));
      auVar58 = vhaddps_avx(auVar58,auVar113);
      auVar113 = vblendps_avx(auVar58,auVar116,0xf0);
      auVar116 = vperm2f128_avx(auVar58,auVar116,0x21);
      local_58 = auVar88._0_4_;
      fStack_54 = auVar88._4_4_;
      fStack_50 = auVar88._8_4_;
      fStack_4c = auVar88._12_4_;
      fStack_48 = auVar88._16_4_;
      fStack_44 = auVar88._20_4_;
      fStack_40 = auVar88._24_4_;
      fStack_3c = auVar88._28_4_;
      fVar54 = auVar116._0_4_ + local_58 + auVar113._0_4_;
      fVar64 = auVar116._4_4_ + fStack_54 + auVar113._4_4_;
      auVar58._0_8_ = CONCAT44(fVar64,fVar54);
      auVar58._8_4_ = auVar116._8_4_ + fStack_50 + auVar113._8_4_;
      auVar58._12_4_ = auVar116._12_4_ + fStack_4c + auVar113._12_4_;
      auVar58._16_4_ = auVar116._16_4_ + fStack_48 + auVar113._16_4_;
      auVar58._20_4_ = auVar116._20_4_ + fStack_44 + auVar113._20_4_;
      auVar58._24_4_ = auVar116._24_4_ + fStack_40 + auVar113._24_4_;
      auVar58._28_4_ = auVar116._28_4_ + fStack_3c + auVar113._28_4_;
      auVar88 = auVar58;
      if (5 < *(int *)(p_Var31 + 0x38 + (long)&(this->weight_data_int8).data) - 1U)
      goto switchD_001c7767_caseD_1;
      auVar55 = ZEXT816(0) << 0x40;
      auVar88 = vmaxps_avx(auVar58,ZEXT1632(auVar55));
      switch(*(int *)(p_Var31 + 0x38 + (long)&(this->weight_data_int8).data)) {
      case 2:
        auVar113 = vminps_avx(auVar58,ZEXT1632(auVar55));
        uVar3 = **(undefined4 **)(p_Var31 + 0x40 + (long)&(this->weight_data_int8).data);
        auVar87._4_4_ = uVar3;
        auVar87._0_4_ = uVar3;
        auVar87._8_4_ = uVar3;
        auVar87._12_4_ = uVar3;
        auVar87._16_4_ = uVar3;
        auVar87._20_4_ = uVar3;
        auVar87._24_4_ = uVar3;
        auVar87._28_4_ = uVar3;
        auVar55 = vfmadd231ps_fma(auVar88,auVar113,auVar87);
        auVar88 = ZEXT1632(auVar55);
        break;
      case 3:
        uVar3 = **(undefined4 **)(p_Var31 + 0x40 + (long)&(this->weight_data_int8).data);
        auVar71._4_4_ = uVar3;
        auVar71._0_4_ = uVar3;
        auVar71._8_4_ = uVar3;
        auVar71._12_4_ = uVar3;
        auVar71._16_4_ = uVar3;
        auVar71._20_4_ = uVar3;
        auVar71._24_4_ = uVar3;
        auVar71._28_4_ = uVar3;
        uVar3 = (*(undefined4 **)(p_Var31 + 0x40 + (long)&(this->weight_data_int8).data))[1];
        auVar90._4_4_ = uVar3;
        auVar90._0_4_ = uVar3;
        auVar90._8_4_ = uVar3;
        auVar90._12_4_ = uVar3;
        auVar90._16_4_ = uVar3;
        auVar90._20_4_ = uVar3;
        auVar90._24_4_ = uVar3;
        auVar90._28_4_ = uVar3;
        auVar88 = vmaxps_avx(auVar58,auVar71);
        auVar88 = vminps_avx(auVar88,auVar90);
        break;
      case 4:
        auVar59._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
        auVar59._8_4_ = -auVar58._8_4_;
        auVar59._12_4_ = -auVar58._12_4_;
        auVar59._16_4_ = -auVar58._16_4_;
        auVar59._20_4_ = -auVar58._20_4_;
        auVar59._24_4_ = -auVar58._24_4_;
        auVar59._28_4_ = -auVar58._28_4_;
        auVar72._8_4_ = 0x42b0c0a5;
        auVar72._0_8_ = 0x42b0c0a542b0c0a5;
        auVar72._12_4_ = 0x42b0c0a5;
        auVar72._16_4_ = 0x42b0c0a5;
        auVar72._20_4_ = 0x42b0c0a5;
        auVar72._24_4_ = 0x42b0c0a5;
        auVar72._28_4_ = 0x42b0c0a5;
        auVar88 = vminps_avx(auVar59,auVar72);
        auVar73._8_4_ = 0xc2b0c0a5;
        auVar73._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar73._12_4_ = 0xc2b0c0a5;
        auVar73._16_4_ = 0xc2b0c0a5;
        auVar73._20_4_ = 0xc2b0c0a5;
        auVar73._24_4_ = 0xc2b0c0a5;
        auVar73._28_4_ = 0xc2b0c0a5;
        auVar113 = vmaxps_avx(auVar88,auVar73);
        auVar74._8_4_ = 0x3fb8aa3b;
        auVar74._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar74._12_4_ = 0x3fb8aa3b;
        auVar74._16_4_ = 0x3fb8aa3b;
        auVar74._20_4_ = 0x3fb8aa3b;
        auVar74._24_4_ = 0x3fb8aa3b;
        auVar74._28_4_ = 0x3fb8aa3b;
        auVar115._8_4_ = 0x3f000000;
        auVar115._0_8_ = 0x3f0000003f000000;
        auVar115._12_4_ = 0x3f000000;
        auVar115._16_4_ = 0x3f000000;
        auVar115._20_4_ = 0x3f000000;
        auVar115._24_4_ = 0x3f000000;
        auVar115._28_4_ = 0x3f000000;
        auVar55 = vfmadd213ps_fma(auVar74,auVar113,auVar115);
        auVar116 = vroundps_avx(ZEXT1632(auVar55),1);
        auVar88 = vcmpps_avx(ZEXT1632(auVar55),auVar116,1);
        auVar126._8_4_ = 0x3f800000;
        auVar126._0_8_ = 0x3f8000003f800000;
        auVar126._12_4_ = 0x3f800000;
        auVar126._16_4_ = 0x3f800000;
        auVar126._20_4_ = 0x3f800000;
        auVar126._24_4_ = 0x3f800000;
        auVar126._28_4_ = 0x3f800000;
        auVar88 = vandps_avx(auVar88,auVar126);
        auVar88 = vsubps_avx(auVar116,auVar88);
        auVar91._8_4_ = 0xbf317218;
        auVar91._0_8_ = 0xbf317218bf317218;
        auVar91._12_4_ = 0xbf317218;
        auVar91._16_4_ = 0xbf317218;
        auVar91._20_4_ = 0xbf317218;
        auVar91._24_4_ = 0xbf317218;
        auVar91._28_4_ = 0xbf317218;
        auVar56 = vfmadd231ps_fma(auVar113,auVar88,auVar91);
        auVar113 = ZEXT1632(auVar56);
        fVar54 = auVar56._0_4_;
        fVar64 = auVar56._4_4_;
        fVar65 = auVar56._8_4_;
        fVar66 = auVar56._12_4_;
        auVar14._28_4_ = 0xbf317218;
        auVar14._0_28_ =
             ZEXT1628(CONCAT412(fVar66 * fVar66,
                                CONCAT48(fVar65 * fVar65,CONCAT44(fVar64 * fVar64,fVar54 * fVar54)))
                     );
        auVar106._8_4_ = 0x39506967;
        auVar106._0_8_ = 0x3950696739506967;
        auVar106._12_4_ = 0x39506967;
        auVar106._16_4_ = 0x39506967;
        auVar106._20_4_ = 0x39506967;
        auVar106._24_4_ = 0x39506967;
        auVar106._28_4_ = 0x39506967;
        auVar145._8_4_ = 0x3ab743ce;
        auVar145._0_8_ = 0x3ab743ce3ab743ce;
        auVar145._12_4_ = 0x3ab743ce;
        auVar145._16_4_ = 0x3ab743ce;
        auVar145._20_4_ = 0x3ab743ce;
        auVar145._24_4_ = 0x3ab743ce;
        auVar145._28_4_ = 0x3ab743ce;
        auVar55 = vfmadd213ps_fma(auVar106,auVar113,auVar145);
        auVar146._8_4_ = 0x3c088908;
        auVar146._0_8_ = 0x3c0889083c088908;
        auVar146._12_4_ = 0x3c088908;
        auVar146._16_4_ = 0x3c088908;
        auVar146._20_4_ = 0x3c088908;
        auVar146._24_4_ = 0x3c088908;
        auVar146._28_4_ = 0x3c088908;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar113,auVar146);
        auVar147._8_4_ = 0x3d2aa9c1;
        auVar147._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar147._12_4_ = 0x3d2aa9c1;
        auVar147._16_4_ = 0x3d2aa9c1;
        auVar147._20_4_ = 0x3d2aa9c1;
        auVar147._24_4_ = 0x3d2aa9c1;
        auVar147._28_4_ = 0x3d2aa9c1;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar113,auVar147);
        auVar148._8_4_ = 0x3e2aaaaa;
        auVar148._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar148._12_4_ = 0x3e2aaaaa;
        auVar148._16_4_ = 0x3e2aaaaa;
        auVar148._20_4_ = 0x3e2aaaaa;
        auVar148._24_4_ = 0x3e2aaaaa;
        auVar148._28_4_ = 0x3e2aaaaa;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar56),auVar148);
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar56),auVar115);
        auVar60._0_4_ = fVar54 + 1.0;
        auVar60._4_4_ = fVar64 + 1.0;
        auVar60._8_4_ = fVar65 + 1.0;
        auVar60._12_4_ = fVar66 + 1.0;
        auVar60._16_4_ = 0x3f800000;
        auVar60._20_4_ = 0x3f800000;
        auVar60._24_4_ = 0x3f800000;
        auVar60._28_4_ = 0x3f800000;
        auVar55 = vfmadd231ps_fma(auVar60,auVar14,ZEXT1632(auVar55));
        auVar75._0_4_ = (int)auVar88._0_4_;
        auVar75._4_4_ = (int)auVar88._4_4_;
        auVar75._8_4_ = (int)auVar88._8_4_;
        auVar75._12_4_ = (int)auVar88._12_4_;
        auVar75._16_4_ = (int)auVar88._16_4_;
        auVar75._20_4_ = (int)auVar88._20_4_;
        auVar75._24_4_ = (int)auVar88._24_4_;
        auVar75._28_4_ = (int)auVar88._28_4_;
        auVar88 = vpslld_avx2(auVar75,0x17);
        auVar92._8_4_ = 0x3f800000;
        auVar92._0_8_ = 0x3f8000003f800000;
        auVar92._12_4_ = 0x3f800000;
        auVar92._16_4_ = 0x3f800000;
        auVar92._20_4_ = 0x3f800000;
        auVar92._24_4_ = 0x3f800000;
        auVar92._28_4_ = 0x3f800000;
        auVar88 = vpaddd_avx2(auVar88,auVar92);
        auVar55 = vfmadd213ps_fma(auVar88,ZEXT1632(auVar55),auVar126);
        auVar88 = vrcpps_avx(ZEXT1632(auVar55));
        auVar55 = vfmsub213ps_fma(ZEXT1632(auVar55),auVar88,auVar126);
        auVar55 = vfnmadd132ps_fma(ZEXT1632(auVar55),auVar88,auVar88);
        auVar88 = ZEXT1632(auVar55);
        break;
      case 5:
        auVar162._8_4_ = 0x42b0c0a5;
        auVar162._0_8_ = 0x42b0c0a542b0c0a5;
        auVar162._12_4_ = 0x42b0c0a5;
        auVar162._16_4_ = 0x42b0c0a5;
        auVar162._20_4_ = 0x42b0c0a5;
        auVar162._24_4_ = 0x42b0c0a5;
        auVar162._28_4_ = 0x42b0c0a5;
        auVar88 = vminps_avx(auVar58,auVar162);
        auVar169._8_4_ = 0xc2b0c0a5;
        auVar169._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar169._12_4_ = 0xc2b0c0a5;
        auVar169._16_4_ = 0xc2b0c0a5;
        auVar169._20_4_ = 0xc2b0c0a5;
        auVar169._24_4_ = 0xc2b0c0a5;
        auVar169._28_4_ = 0xc2b0c0a5;
        auVar113 = vmaxps_avx(auVar169,auVar88);
        auVar174._8_4_ = 0x3fb8aa3b;
        auVar174._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar174._12_4_ = 0x3fb8aa3b;
        auVar174._16_4_ = 0x3fb8aa3b;
        auVar174._20_4_ = 0x3fb8aa3b;
        auVar174._24_4_ = 0x3fb8aa3b;
        auVar174._28_4_ = 0x3fb8aa3b;
        auVar176._8_4_ = 0x3f000000;
        auVar176._0_8_ = 0x3f0000003f000000;
        auVar176._12_4_ = 0x3f000000;
        auVar176._16_4_ = 0x3f000000;
        auVar176._20_4_ = 0x3f000000;
        auVar176._24_4_ = 0x3f000000;
        auVar176._28_4_ = 0x3f000000;
        auVar55 = vfmadd213ps_fma(auVar174,auVar113,auVar176);
        auVar116 = vroundps_avx(ZEXT1632(auVar55),1);
        auVar88 = vcmpps_avx(ZEXT1632(auVar55),auVar116,1);
        auVar178._8_4_ = 0x3f800000;
        auVar178._0_8_ = 0x3f8000003f800000;
        auVar178._12_4_ = 0x3f800000;
        auVar178._16_4_ = 0x3f800000;
        auVar178._20_4_ = 0x3f800000;
        auVar178._24_4_ = 0x3f800000;
        auVar178._28_4_ = 0x3f800000;
        auVar88 = vandps_avx(auVar178,auVar88);
        auVar88 = vsubps_avx(auVar116,auVar88);
        auVar163._8_4_ = 0x3f317218;
        auVar163._0_8_ = 0x3f3172183f317218;
        auVar163._12_4_ = 0x3f317218;
        auVar163._16_4_ = 0x3f317218;
        auVar163._20_4_ = 0x3f317218;
        auVar163._24_4_ = 0x3f317218;
        auVar163._28_4_ = 0x3f317218;
        auVar56 = vfnmadd231ps_fma(auVar113,auVar88,auVar163);
        auVar113 = ZEXT1632(auVar56);
        fVar65 = auVar56._0_4_;
        fVar66 = auVar56._4_4_;
        fVar100 = auVar56._8_4_;
        fVar9 = auVar56._12_4_;
        auVar10._28_4_ = auVar116._28_4_;
        auVar10._0_28_ =
             ZEXT1628(CONCAT412(fVar9 * fVar9,
                                CONCAT48(fVar100 * fVar100,CONCAT44(fVar66 * fVar66,fVar65 * fVar65)
                                        )));
        auVar180._8_4_ = 0x39506967;
        auVar180._0_8_ = 0x3950696739506967;
        auVar180._12_4_ = 0x39506967;
        auVar180._16_4_ = 0x39506967;
        auVar180._20_4_ = 0x39506967;
        auVar180._24_4_ = 0x39506967;
        auVar180._28_4_ = 0x39506967;
        auVar183._8_4_ = 0x3ab743ce;
        auVar183._0_8_ = 0x3ab743ce3ab743ce;
        auVar183._12_4_ = 0x3ab743ce;
        auVar183._16_4_ = 0x3ab743ce;
        auVar183._20_4_ = 0x3ab743ce;
        auVar183._24_4_ = 0x3ab743ce;
        auVar183._28_4_ = 0x3ab743ce;
        auVar55 = vfmadd213ps_fma(auVar180,auVar113,auVar183);
        auVar185._8_4_ = 0x3c088908;
        auVar185._0_8_ = 0x3c0889083c088908;
        auVar185._12_4_ = 0x3c088908;
        auVar185._16_4_ = 0x3c088908;
        auVar185._20_4_ = 0x3c088908;
        auVar185._24_4_ = 0x3c088908;
        auVar185._28_4_ = 0x3c088908;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar113,auVar185);
        auVar187._8_4_ = 0x3d2aa9c1;
        auVar187._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar187._12_4_ = 0x3d2aa9c1;
        auVar187._16_4_ = 0x3d2aa9c1;
        auVar187._20_4_ = 0x3d2aa9c1;
        auVar187._24_4_ = 0x3d2aa9c1;
        auVar187._28_4_ = 0x3d2aa9c1;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar113,auVar187);
        auVar119._8_4_ = 0x3e2aaaaa;
        auVar119._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar119._12_4_ = 0x3e2aaaaa;
        auVar119._16_4_ = 0x3e2aaaaa;
        auVar119._20_4_ = 0x3e2aaaaa;
        auVar119._24_4_ = 0x3e2aaaaa;
        auVar119._28_4_ = 0x3e2aaaaa;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar56),auVar119);
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar56),auVar176);
        auVar120._0_4_ = fVar65 + 1.0;
        auVar120._4_4_ = fVar66 + 1.0;
        auVar120._8_4_ = fVar100 + 1.0;
        auVar120._12_4_ = fVar9 + 1.0;
        auVar120._16_4_ = 0x3f800000;
        auVar120._20_4_ = 0x3f800000;
        auVar120._24_4_ = 0x3f800000;
        auVar120._28_4_ = 0x3f800000;
        auVar55 = vfmadd231ps_fma(auVar120,auVar10,ZEXT1632(auVar55));
        auVar69._0_4_ = (int)auVar88._0_4_;
        auVar69._4_4_ = (int)auVar88._4_4_;
        auVar69._8_4_ = (int)auVar88._8_4_;
        auVar69._12_4_ = (int)auVar88._12_4_;
        auVar69._16_4_ = (int)auVar88._16_4_;
        auVar69._20_4_ = (int)auVar88._20_4_;
        auVar69._24_4_ = (int)auVar88._24_4_;
        auVar69._28_4_ = (int)auVar88._28_4_;
        auVar88 = vpslld_avx2(auVar69,0x17);
        auVar70._8_4_ = 0x3f800000;
        auVar70._0_8_ = 0x3f8000003f800000;
        auVar70._12_4_ = 0x3f800000;
        auVar70._16_4_ = 0x3f800000;
        auVar70._20_4_ = 0x3f800000;
        auVar70._24_4_ = 0x3f800000;
        auVar70._28_4_ = 0x3f800000;
        auVar88 = vpaddd_avx2(auVar88,auVar70);
        auVar55 = vfmadd213ps_fma(auVar88,ZEXT1632(auVar55),auVar178);
        auVar101._8_4_ = 0x800000;
        auVar101._0_8_ = 0x80000000800000;
        auVar101._12_4_ = 0x800000;
        auVar101._16_4_ = 0x800000;
        auVar101._20_4_ = 0x800000;
        auVar101._24_4_ = 0x800000;
        auVar101._28_4_ = 0x800000;
        auVar88 = vmaxps_avx(ZEXT1632(auVar55),auVar101);
        auVar113 = vpsrld_avx2(auVar88,0x17);
        auVar121._8_4_ = 0x807fffff;
        auVar121._0_8_ = 0x807fffff807fffff;
        auVar121._12_4_ = 0x807fffff;
        auVar121._16_4_ = 0x807fffff;
        auVar121._20_4_ = 0x807fffff;
        auVar121._24_4_ = 0x807fffff;
        auVar121._28_4_ = 0x807fffff;
        auVar88 = vandps_avx(auVar88,auVar121);
        auVar122._8_4_ = 0x3f000000;
        auVar122._0_8_ = 0x3f0000003f000000;
        auVar122._12_4_ = 0x3f000000;
        auVar122._16_4_ = 0x3f000000;
        auVar122._20_4_ = 0x3f000000;
        auVar122._24_4_ = 0x3f000000;
        auVar122._28_4_ = 0x3f000000;
        auVar116 = vorps_avx(auVar88,auVar122);
        auVar123._8_4_ = 0xffffff82;
        auVar123._0_8_ = 0xffffff82ffffff82;
        auVar123._12_4_ = 0xffffff82;
        auVar123._16_4_ = 0xffffff82;
        auVar123._20_4_ = 0xffffff82;
        auVar123._24_4_ = 0xffffff82;
        auVar123._28_4_ = 0xffffff82;
        auVar10 = vpaddd_avx2(auVar113,auVar123);
        auVar124._8_4_ = 0x3f3504f3;
        auVar124._0_8_ = 0x3f3504f33f3504f3;
        auVar124._12_4_ = 0x3f3504f3;
        auVar124._16_4_ = 0x3f3504f3;
        auVar124._20_4_ = 0x3f3504f3;
        auVar124._24_4_ = 0x3f3504f3;
        auVar124._28_4_ = 0x3f3504f3;
        auVar113 = vcmpps_avx(auVar116,auVar124,1);
        auVar88 = vandps_avx(auVar113,auVar116);
        auVar170._8_4_ = 0xbf800000;
        auVar170._0_8_ = 0xbf800000bf800000;
        auVar170._12_4_ = 0xbf800000;
        auVar170._16_4_ = 0xbf800000;
        auVar170._20_4_ = 0xbf800000;
        auVar170._24_4_ = 0xbf800000;
        auVar170._28_4_ = 0xbf800000;
        auVar102._0_4_ = auVar116._0_4_ + -1.0 + auVar88._0_4_;
        auVar102._4_4_ = auVar116._4_4_ + -1.0 + auVar88._4_4_;
        auVar102._8_4_ = auVar116._8_4_ + -1.0 + auVar88._8_4_;
        auVar102._12_4_ = auVar116._12_4_ + -1.0 + auVar88._12_4_;
        auVar102._16_4_ = auVar116._16_4_ + -1.0 + auVar88._16_4_;
        auVar102._20_4_ = auVar116._20_4_ + -1.0 + auVar88._20_4_;
        auVar102._24_4_ = auVar116._24_4_ + -1.0 + auVar88._24_4_;
        auVar102._28_4_ = auVar116._28_4_ + -1.0 + auVar88._28_4_;
        auVar116 = vcmpps_avx(ZEXT1632(auVar55),_DAT_002db860,2);
        auVar10 = vcvtdq2ps_avx(auVar10);
        auVar88 = vandps_avx(auVar178,auVar113);
        auVar88 = vsubps_avx(auVar10,auVar88);
        auVar125._8_4_ = 0x3d9021bb;
        auVar125._0_8_ = 0x3d9021bb3d9021bb;
        auVar125._12_4_ = 0x3d9021bb;
        auVar125._16_4_ = 0x3d9021bb;
        auVar125._20_4_ = 0x3d9021bb;
        auVar125._24_4_ = 0x3d9021bb;
        auVar125._28_4_ = 0x3d9021bb;
        auVar136._8_4_ = 0xbdebd1b8;
        auVar136._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar136._12_4_ = 0xbdebd1b8;
        auVar136._16_4_ = 0xbdebd1b8;
        auVar136._20_4_ = 0xbdebd1b8;
        auVar136._24_4_ = 0xbdebd1b8;
        auVar136._28_4_ = 0xbdebd1b8;
        auVar55 = vfmadd213ps_fma(auVar125,auVar102,auVar136);
        auVar137._8_4_ = 0x3def251a;
        auVar137._0_8_ = 0x3def251a3def251a;
        auVar137._12_4_ = 0x3def251a;
        auVar137._16_4_ = 0x3def251a;
        auVar137._20_4_ = 0x3def251a;
        auVar137._24_4_ = 0x3def251a;
        auVar137._28_4_ = 0x3def251a;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar102,auVar137);
        auVar138._8_4_ = 0xbdfe5d4f;
        auVar138._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar138._12_4_ = 0xbdfe5d4f;
        auVar138._16_4_ = 0xbdfe5d4f;
        auVar138._20_4_ = 0xbdfe5d4f;
        auVar138._24_4_ = 0xbdfe5d4f;
        auVar138._28_4_ = 0xbdfe5d4f;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar102,auVar138);
        auVar139._8_4_ = 0x3e11e9bf;
        auVar139._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar139._12_4_ = 0x3e11e9bf;
        auVar139._16_4_ = 0x3e11e9bf;
        auVar139._20_4_ = 0x3e11e9bf;
        auVar139._24_4_ = 0x3e11e9bf;
        auVar139._28_4_ = 0x3e11e9bf;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar102,auVar139);
        auVar140._8_4_ = 0xbe2aae50;
        auVar140._0_8_ = 0xbe2aae50be2aae50;
        auVar140._12_4_ = 0xbe2aae50;
        auVar140._16_4_ = 0xbe2aae50;
        auVar140._20_4_ = 0xbe2aae50;
        auVar140._24_4_ = 0xbe2aae50;
        auVar140._28_4_ = 0xbe2aae50;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar102,auVar140);
        auVar141._8_4_ = 0x3e4cceac;
        auVar141._0_8_ = 0x3e4cceac3e4cceac;
        auVar141._12_4_ = 0x3e4cceac;
        auVar141._16_4_ = 0x3e4cceac;
        auVar141._20_4_ = 0x3e4cceac;
        auVar141._24_4_ = 0x3e4cceac;
        auVar141._28_4_ = 0x3e4cceac;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar102,auVar141);
        auVar142._8_4_ = 0xbe7ffffc;
        auVar142._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar142._12_4_ = 0xbe7ffffc;
        auVar142._16_4_ = 0xbe7ffffc;
        auVar142._20_4_ = 0xbe7ffffc;
        auVar142._24_4_ = 0xbe7ffffc;
        auVar142._28_4_ = 0xbe7ffffc;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar102,auVar142);
        auVar143._8_4_ = 0x3eaaaaaa;
        auVar143._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar143._12_4_ = 0x3eaaaaaa;
        auVar143._16_4_ = 0x3eaaaaaa;
        auVar143._20_4_ = 0x3eaaaaaa;
        auVar143._24_4_ = 0x3eaaaaaa;
        auVar143._28_4_ = 0x3eaaaaaa;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar102,auVar143);
        auVar56 = vfmsub213ps_fma(ZEXT1632(auVar55),auVar102,auVar176);
        auVar55 = vfmadd213ps_fma(auVar88,auVar163,auVar102);
        auVar11._4_4_ = auVar102._4_4_ * auVar102._4_4_;
        auVar11._0_4_ = auVar102._0_4_ * auVar102._0_4_;
        auVar11._8_4_ = auVar102._8_4_ * auVar102._8_4_;
        auVar11._12_4_ = auVar102._12_4_ * auVar102._12_4_;
        auVar11._16_4_ = auVar102._16_4_ * auVar102._16_4_;
        auVar11._20_4_ = auVar102._20_4_ * auVar102._20_4_;
        auVar11._24_4_ = auVar102._24_4_ * auVar102._24_4_;
        auVar11._28_4_ = auVar102._28_4_;
        auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar11,ZEXT1632(auVar56));
        auVar144._8_4_ = 0xc0000000;
        auVar144._0_8_ = 0xc0000000c0000000;
        auVar144._12_4_ = 0xc0000000;
        auVar144._16_4_ = 0xc0000000;
        auVar144._20_4_ = 0xc0000000;
        auVar144._24_4_ = 0xc0000000;
        auVar144._28_4_ = 0xc0000000;
        auVar12._4_4_ = auVar55._4_4_ * -2.0;
        auVar12._0_4_ = auVar55._0_4_ * -2.0;
        auVar12._8_4_ = auVar55._8_4_ * -2.0;
        auVar12._12_4_ = auVar55._12_4_ * -2.0;
        auVar12._16_4_ = 0x80000000;
        auVar12._20_4_ = 0x80000000;
        auVar12._24_4_ = 0x80000000;
        auVar12._28_4_ = auVar102._28_4_;
        auVar114._8_4_ = 0x7fffffff;
        auVar114._0_8_ = 0x7fffffff7fffffff;
        auVar114._12_4_ = 0x7fffffff;
        auVar114._16_4_ = 0x7fffffff;
        auVar114._20_4_ = 0x7fffffff;
        auVar114._24_4_ = 0x7fffffff;
        auVar114._28_4_ = 0x7fffffff;
        auVar88 = vblendvps_avx(auVar12,auVar114,auVar116);
        auVar103._8_4_ = 0x42b0c0a5;
        auVar103._0_8_ = 0x42b0c0a542b0c0a5;
        auVar103._12_4_ = 0x42b0c0a5;
        auVar103._16_4_ = 0x42b0c0a5;
        auVar103._20_4_ = 0x42b0c0a5;
        auVar103._24_4_ = 0x42b0c0a5;
        auVar103._28_4_ = 0x42b0c0a5;
        auVar88 = vminps_avx(auVar88,auVar103);
        auVar104._8_4_ = 0xc2b0c0a5;
        auVar104._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar104._12_4_ = 0xc2b0c0a5;
        auVar104._16_4_ = 0xc2b0c0a5;
        auVar104._20_4_ = 0xc2b0c0a5;
        auVar104._24_4_ = 0xc2b0c0a5;
        auVar104._28_4_ = 0xc2b0c0a5;
        auVar113 = vmaxps_avx(auVar88,auVar104);
        auVar55 = vfmadd213ps_fma(auVar174,auVar113,auVar176);
        auVar116 = vroundps_avx(ZEXT1632(auVar55),1);
        auVar88 = vcmpps_avx(ZEXT1632(auVar55),auVar116,1);
        auVar88 = vandps_avx(auVar178,auVar88);
        auVar88 = vsubps_avx(auVar116,auVar88);
        auVar56 = vfnmadd231ps_fma(auVar113,auVar88,auVar163);
        auVar113 = ZEXT1632(auVar56);
        fVar65 = auVar56._0_4_;
        fVar66 = auVar56._4_4_;
        fVar100 = auVar56._8_4_;
        fVar9 = auVar56._12_4_;
        auVar13._28_4_ = auVar116._28_4_;
        auVar13._0_28_ =
             ZEXT1628(CONCAT412(fVar9 * fVar9,
                                CONCAT48(fVar100 * fVar100,CONCAT44(fVar66 * fVar66,fVar65 * fVar65)
                                        )));
        auVar55 = vfmadd213ps_fma(auVar180,auVar113,auVar183);
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar113,auVar185);
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar113,auVar187);
        auVar164._8_4_ = 0x3e2aaaaa;
        auVar164._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar164._12_4_ = 0x3e2aaaaa;
        auVar164._16_4_ = 0x3e2aaaaa;
        auVar164._20_4_ = 0x3e2aaaaa;
        auVar164._24_4_ = 0x3e2aaaaa;
        auVar164._28_4_ = 0x3e2aaaaa;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar56),auVar164);
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar56),auVar176);
        auVar89._0_4_ = fVar65 + 1.0;
        auVar89._4_4_ = fVar66 + 1.0;
        auVar89._8_4_ = fVar100 + 1.0;
        auVar89._12_4_ = fVar9 + 1.0;
        auVar89._16_4_ = 0x3f800000;
        auVar89._20_4_ = 0x3f800000;
        auVar89._24_4_ = 0x3f800000;
        auVar89._28_4_ = 0x3f800000;
        auVar55 = vfmadd231ps_fma(auVar89,auVar13,ZEXT1632(auVar55));
        auVar105._0_4_ = (int)auVar88._0_4_;
        auVar105._4_4_ = (int)auVar88._4_4_;
        auVar105._8_4_ = (int)auVar88._8_4_;
        auVar105._12_4_ = (int)auVar88._12_4_;
        auVar105._16_4_ = (int)auVar88._16_4_;
        auVar105._20_4_ = (int)auVar88._20_4_;
        auVar105._24_4_ = (int)auVar88._24_4_;
        auVar105._28_4_ = (int)auVar88._28_4_;
        auVar88 = vpslld_avx2(auVar105,0x17);
        auVar88 = vpaddd_avx2(auVar88,auVar70);
        auVar55 = vfmadd213ps_fma(auVar88,ZEXT1632(auVar55),auVar178);
        auVar88 = vrcpps_avx(ZEXT1632(auVar55));
        auVar55 = vfmsub213ps_fma(ZEXT1632(auVar55),auVar88,auVar178);
        auVar55 = vfnmadd132ps_fma(ZEXT1632(auVar55),auVar88,auVar88);
        auVar55 = vfnmadd213ps_fma(ZEXT1632(auVar55),auVar144,auVar170);
        auVar84 = ZEXT1664(auVar55);
        goto LAB_001c7b44;
      case 6:
        uVar3 = **(undefined4 **)(p_Var31 + 0x40 + (long)&(this->weight_data_int8).data);
        auVar88._4_4_ = uVar3;
        auVar88._0_4_ = uVar3;
        auVar88._8_4_ = uVar3;
        auVar88._12_4_ = uVar3;
        auVar88._16_4_ = uVar3;
        auVar88._20_4_ = uVar3;
        auVar88._24_4_ = uVar3;
        auVar88._28_4_ = uVar3;
        uVar3 = (*(undefined4 **)(p_Var31 + 0x40 + (long)&(this->weight_data_int8).data))[1];
        auVar113._4_4_ = uVar3;
        auVar113._0_4_ = uVar3;
        auVar113._8_4_ = uVar3;
        auVar113._12_4_ = uVar3;
        auVar113._16_4_ = uVar3;
        auVar113._20_4_ = uVar3;
        auVar113._24_4_ = uVar3;
        auVar113._28_4_ = uVar3;
        auVar56 = vfmadd231ps_fma(auVar113,auVar58,auVar88);
        auVar88 = vmaxps_avx(ZEXT1632(auVar56),ZEXT1632(auVar55));
        auVar116._8_4_ = 0x3f800000;
        auVar116._0_8_ = 0x3f8000003f800000;
        auVar116._12_4_ = 0x3f800000;
        auVar116._16_4_ = 0x3f800000;
        auVar116._20_4_ = 0x3f800000;
        auVar116._24_4_ = 0x3f800000;
        auVar116._28_4_ = 0x3f800000;
        auVar88 = vminps_avx(auVar88,auVar116);
        auVar84 = ZEXT3264(auVar88);
LAB_001c7b44:
        auVar85._0_4_ = auVar84._0_4_ * fVar54;
        auVar85._4_4_ = auVar84._4_4_ * fVar64;
        auVar85._8_4_ = auVar84._8_4_ * auVar58._8_4_;
        auVar85._12_4_ = auVar84._12_4_ * auVar58._12_4_;
        auVar85._16_4_ = auVar84._16_4_ * auVar58._16_4_;
        auVar85._20_4_ = auVar84._20_4_ * auVar58._20_4_;
        auVar85._28_36_ = auVar84._28_36_;
        auVar85._24_4_ = auVar84._24_4_ * auVar58._24_4_;
        auVar88 = auVar85._0_32_;
      }
switchD_001c7767_caseD_1:
      *(undefined1 (*) [32])((long)local_208 + uVar29 * 0x20) = auVar88;
      pvVar39 = (void *)((long)pvVar39 + local_1a0);
      pvVar41 = (void *)((long)pvVar41 + local_1a0);
      pvVar43 = (void *)((long)pvVar43 + local_1a0);
      pvVar45 = (void *)((long)pvVar45 + local_1a0);
      pvVar36 = (void *)((long)pvVar36 + local_1a0);
      pvVar27 = (void *)((long)pvVar27 + local_1a0);
      pvVar33 = (void *)((long)pvVar33 + local_1a0);
      pvVar50 = (void *)((long)pvVar50 + local_1a0);
      uVar53 = local_188 + local_1a0;
      local_230 = uVar29;
      uVar52 = uVar29 + 1;
    }
    uVar52 = local_1a8 & 0xfffffffffffffff8;
    iVar35 = (int)uVar52;
    uVar28 = *(int *)(p_Var31 + 0x28 + (long)&(this->weight_data_int8).data) - iVar35;
    uVar34 = (int)uVar28 >> 2;
    uVar29 = 0;
    uVar53 = (ulong)uVar34;
    if ((int)uVar34 < 1) {
      uVar53 = uVar29;
    }
    auVar175._8_4_ = 0x3fb8aa3b;
    auVar175._0_8_ = 0x3fb8aa3b3fb8aa3b;
    auVar175._12_4_ = 0x3fb8aa3b;
    auVar175._16_4_ = 0x3fb8aa3b;
    auVar175._20_4_ = 0x3fb8aa3b;
    auVar175._24_4_ = 0x3fb8aa3b;
    auVar175._28_4_ = 0x3fb8aa3b;
    auVar177._8_4_ = 0x3f000000;
    auVar177._0_8_ = 0x3f0000003f000000;
    auVar177._12_4_ = 0x3f000000;
    auVar177._16_4_ = 0x3f000000;
    auVar177._20_4_ = 0x3f000000;
    auVar177._24_4_ = 0x3f000000;
    auVar177._28_4_ = 0x3f000000;
    auVar179._8_4_ = 0x3f800000;
    auVar179._0_8_ = 0x3f8000003f800000;
    auVar179._12_4_ = 0x3f800000;
    auVar179._16_4_ = 0x3f800000;
    auVar179._20_4_ = 0x3f800000;
    auVar179._24_4_ = 0x3f800000;
    auVar179._28_4_ = 0x3f800000;
    auVar184._8_4_ = 0x39506967;
    auVar184._0_8_ = 0x3950696739506967;
    auVar184._12_4_ = 0x39506967;
    auVar184._16_4_ = 0x39506967;
    auVar184._20_4_ = 0x39506967;
    auVar184._24_4_ = 0x39506967;
    auVar184._28_4_ = 0x39506967;
    auVar186._8_4_ = 0x3ab743ce;
    auVar186._0_8_ = 0x3ab743ce3ab743ce;
    auVar186._12_4_ = 0x3ab743ce;
    auVar186._16_4_ = 0x3ab743ce;
    auVar186._20_4_ = 0x3ab743ce;
    auVar186._24_4_ = 0x3ab743ce;
    auVar186._28_4_ = 0x3ab743ce;
    auVar188._8_4_ = 0x3c088908;
    auVar188._0_8_ = 0x3c0889083c088908;
    auVar188._12_4_ = 0x3c088908;
    auVar188._16_4_ = 0x3c088908;
    auVar188._20_4_ = 0x3c088908;
    auVar188._24_4_ = 0x3c088908;
    auVar188._28_4_ = 0x3c088908;
    for (; uVar29 != uVar53; uVar29 = uVar29 + 1) {
      uVar1 = uVar52 + uVar29 * 4;
      p_Var31 = local_210[-3];
      if (*(int *)(p_Var31 + 0x2c + (long)&(this->weight_data_int8).data) == 0) {
        fVar54 = 0.0;
        fVar64 = 0.0;
        fVar65 = 0.0;
        fVar66 = 0.0;
      }
      else {
        pfVar2 = (float *)(*(long *)(&this->field_0x178 + (long)p_Var31) + uVar1 * 4);
        fVar54 = *pfVar2;
        fVar64 = pfVar2[1];
        fVar65 = pfVar2[2];
        fVar66 = pfVar2[3];
      }
      pauVar44 = (undefined1 (*) [16])(uVar1 * local_1f0 * 2 + (long)local_200);
      pauVar46 = (undefined1 (*) [16])((uVar1 | 1) * local_1f0 * 2 + (long)local_200);
      pauVar32 = (undefined1 (*) [16])((uVar1 | 2) * local_1f0 * 2 + (long)local_200);
      pauVar51 = (undefined1 (*) [16])((uVar1 | 3) * local_1f0 * 2 + (long)local_200);
      auVar55 = ZEXT816(0) << 0x40;
      auVar56 = ZEXT816(0);
      auVar67 = ZEXT816(0) << 0x40;
      auVar68 = ZEXT816(0) << 0x40;
      pauVar30 = (undefined1 (*) [32])bottom_blob_flattened.data;
      iVar48 = local_224;
      while( true ) {
        auVar113 = ZEXT1632(auVar55);
        if (iVar48 < 1) break;
        auVar116 = *pauVar30;
        auVar55 = vlddqu_avx(*pauVar44);
        auVar58 = vcvtph2ps_f16c(auVar55);
        auVar55 = vfmadd231ps_fma(auVar113,auVar116,auVar58);
        auVar57 = vlddqu_avx(*pauVar46);
        auVar113 = vcvtph2ps_f16c(auVar57);
        auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar116,auVar113);
        auVar57 = vlddqu_avx(*pauVar32);
        auVar113 = vcvtph2ps_f16c(auVar57);
        auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar116,auVar113);
        auVar57 = vlddqu_avx(*pauVar51);
        auVar113 = vcvtph2ps_f16c(auVar57);
        auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar116,auVar113);
        pauVar30 = pauVar30 + 1;
        pauVar44 = pauVar44 + 1;
        pauVar46 = pauVar46 + 1;
        pauVar32 = pauVar32 + 1;
        pauVar51 = pauVar51 + 1;
        iVar48 = iVar48 + -1;
      }
      afVar181 = (float  [8])ZEXT1632(ZEXT816(0) << 0x40);
      if (uVar47 != 0) {
        opt_flatten._0_32_ = ZEXT1632(ZEXT816(0) << 0x40);
        _m_f = afVar181;
        opt_flatten._32_32_ = opt_flatten._0_32_;
        for (uVar42 = 0; uVar47 * 2 != uVar42; uVar42 = uVar42 + 2) {
          *(undefined4 *)((long)_m_f + uVar42 * 2) = *(undefined4 *)(*pauVar30 + uVar42 * 2);
          *(undefined2 *)((long)local_108 + (uVar42 - 0x40)) = *(undefined2 *)(*pauVar44 + uVar42);
          *(undefined2 *)((long)local_108 + (uVar42 - 0x30)) = *(undefined2 *)(*pauVar46 + uVar42);
          *(undefined2 *)((long)local_108 + (uVar42 - 0x20)) = *(undefined2 *)(*pauVar32 + uVar42);
          *(undefined2 *)((long)local_108 + (uVar42 - 0x10)) = *(undefined2 *)(*pauVar51 + uVar42);
        }
        auVar55 = vlddqu_avx((undefined1  [16])opt_flatten._0_16_);
        auVar116 = vcvtph2ps_f16c(auVar55);
        auVar55 = vfmadd231ps_fma(auVar113,(undefined1  [32])_m_f,auVar116);
        auVar113 = ZEXT1632(auVar55);
        auVar55 = vlddqu_avx((undefined1  [16])opt_flatten._16_16_);
        auVar116 = vcvtph2ps_f16c(auVar55);
        auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),(undefined1  [32])_m_f,auVar116);
        auVar55 = vlddqu_avx((undefined1  [16])opt_flatten._32_16_);
        auVar116 = vcvtph2ps_f16c(auVar55);
        auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),(undefined1  [32])_m_f,auVar116);
        auVar55 = vlddqu_avx((undefined1  [16])opt_flatten._48_16_);
        auVar116 = vcvtph2ps_f16c(auVar55);
        auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),(undefined1  [32])_m_f,auVar116);
        p_Var31 = local_210[-3];
      }
      auVar116 = vhaddps_avx(ZEXT1632(auVar67),ZEXT1632(auVar68));
      auVar113 = vhaddps_avx(auVar113,ZEXT1632(auVar56));
      auVar113 = vhaddps_avx(auVar113,auVar116);
      fVar54 = auVar113._0_4_ + fVar54 + auVar113._16_4_;
      fVar64 = auVar113._4_4_ + fVar64 + auVar113._20_4_;
      auVar56._0_8_ = CONCAT44(fVar64,fVar54);
      auVar56._8_4_ = auVar113._8_4_ + fVar65 + auVar113._24_4_;
      auVar56._12_4_ = auVar113._12_4_ + fVar66 + auVar113._28_4_;
      auVar61._16_16_ = auVar56;
      auVar61._0_16_ = auVar56;
      auVar55 = auVar56;
      if (5 < *(int *)(p_Var31 + 0x38 + (long)&(this->weight_data_int8).data) - 1U)
      goto switchD_001c7e14_caseD_1;
      auVar113 = vmaxps_avx((undefined1  [32])afVar181,auVar61);
      auVar55 = auVar113._0_16_;
      switch(*(int *)(p_Var31 + 0x38 + (long)&(this->weight_data_int8).data)) {
      case 2:
        auVar116 = vminps_avx((undefined1  [32])afVar181,auVar61);
        uVar3 = **(undefined4 **)(p_Var31 + 0x40 + (long)&(this->weight_data_int8).data);
        auVar93._4_4_ = uVar3;
        auVar93._0_4_ = uVar3;
        auVar93._8_4_ = uVar3;
        auVar93._12_4_ = uVar3;
        auVar93._16_4_ = uVar3;
        auVar93._20_4_ = uVar3;
        auVar93._24_4_ = uVar3;
        auVar93._28_4_ = uVar3;
        auVar55 = vfmadd231ps_fma(auVar113,auVar116,auVar93);
        break;
      case 3:
        uVar3 = **(undefined4 **)(p_Var31 + 0x40 + (long)&(this->weight_data_int8).data);
        auVar78._4_4_ = uVar3;
        auVar78._0_4_ = uVar3;
        auVar78._8_4_ = uVar3;
        auVar78._12_4_ = uVar3;
        auVar78._16_4_ = uVar3;
        auVar78._20_4_ = uVar3;
        auVar78._24_4_ = uVar3;
        auVar78._28_4_ = uVar3;
        uVar3 = (*(undefined4 **)(p_Var31 + 0x40 + (long)&(this->weight_data_int8).data))[1];
        auVar95._4_4_ = uVar3;
        auVar95._0_4_ = uVar3;
        auVar95._8_4_ = uVar3;
        auVar95._12_4_ = uVar3;
        auVar95._16_4_ = uVar3;
        auVar95._20_4_ = uVar3;
        auVar95._24_4_ = uVar3;
        auVar95._28_4_ = uVar3;
        auVar113 = vmaxps_avx(auVar61,auVar78);
        auVar113 = vminps_avx(auVar113,auVar95);
        auVar55 = auVar113._0_16_;
        break;
      case 4:
        auVar62._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
        auVar62._8_4_ = -auVar56._8_4_;
        auVar62._12_4_ = -auVar56._12_4_;
        auVar62._16_4_ = -fVar54;
        auVar62._20_4_ = -fVar64;
        auVar62._24_4_ = -auVar56._8_4_;
        auVar62._28_4_ = -auVar56._12_4_;
        auVar79._8_4_ = 0x42b0c0a5;
        auVar79._0_8_ = 0x42b0c0a542b0c0a5;
        auVar79._12_4_ = 0x42b0c0a5;
        auVar79._16_4_ = 0x42b0c0a5;
        auVar79._20_4_ = 0x42b0c0a5;
        auVar79._24_4_ = 0x42b0c0a5;
        auVar79._28_4_ = 0x42b0c0a5;
        auVar113 = vminps_avx(auVar62,auVar79);
        auVar80._8_4_ = 0xc2b0c0a5;
        auVar80._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar80._12_4_ = 0xc2b0c0a5;
        auVar80._16_4_ = 0xc2b0c0a5;
        auVar80._20_4_ = 0xc2b0c0a5;
        auVar80._24_4_ = 0xc2b0c0a5;
        auVar80._28_4_ = 0xc2b0c0a5;
        auVar116 = vmaxps_avx(auVar113,auVar80);
        auVar81._8_4_ = 0x3fb8aa3b;
        auVar81._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar81._12_4_ = 0x3fb8aa3b;
        auVar81._16_4_ = 0x3fb8aa3b;
        auVar81._20_4_ = 0x3fb8aa3b;
        auVar81._24_4_ = 0x3fb8aa3b;
        auVar81._28_4_ = 0x3fb8aa3b;
        auVar118._8_4_ = 0x3f000000;
        auVar118._0_8_ = 0x3f0000003f000000;
        auVar118._12_4_ = 0x3f000000;
        auVar118._16_4_ = 0x3f000000;
        auVar118._20_4_ = 0x3f000000;
        auVar118._24_4_ = 0x3f000000;
        auVar118._28_4_ = 0x3f000000;
        auVar55 = vfmadd213ps_fma(auVar81,auVar116,auVar118);
        auVar58 = vroundps_avx(ZEXT1632(auVar55),1);
        auVar113 = vcmpps_avx(ZEXT1632(auVar55),auVar58,1);
        auVar135._8_4_ = 0x3f800000;
        auVar135._0_8_ = 0x3f8000003f800000;
        auVar135._12_4_ = 0x3f800000;
        auVar135._16_4_ = 0x3f800000;
        auVar135._20_4_ = 0x3f800000;
        auVar135._24_4_ = 0x3f800000;
        auVar135._28_4_ = 0x3f800000;
        auVar113 = vandps_avx(auVar113,auVar135);
        auVar113 = vsubps_avx(auVar58,auVar113);
        auVar96._8_4_ = 0xbf317218;
        auVar96._0_8_ = 0xbf317218bf317218;
        auVar96._12_4_ = 0xbf317218;
        auVar96._16_4_ = 0xbf317218;
        auVar96._20_4_ = 0xbf317218;
        auVar96._24_4_ = 0xbf317218;
        auVar96._28_4_ = 0xbf317218;
        auVar56 = vfmadd231ps_fma(auVar116,auVar113,auVar96);
        auVar116 = ZEXT1632(auVar56);
        fVar54 = auVar56._0_4_;
        fVar64 = auVar56._4_4_;
        fVar65 = auVar56._8_4_;
        fVar66 = auVar56._12_4_;
        auVar19._28_4_ = 0xbf317218;
        auVar19._0_28_ =
             ZEXT1628(CONCAT412(fVar66 * fVar66,
                                CONCAT48(fVar65 * fVar65,CONCAT44(fVar64 * fVar64,fVar54 * fVar54)))
                     );
        auVar112._8_4_ = 0x39506967;
        auVar112._0_8_ = 0x3950696739506967;
        auVar112._12_4_ = 0x39506967;
        auVar112._16_4_ = 0x39506967;
        auVar112._20_4_ = 0x39506967;
        auVar112._24_4_ = 0x39506967;
        auVar112._28_4_ = 0x39506967;
        auVar158._8_4_ = 0x3ab743ce;
        auVar158._0_8_ = 0x3ab743ce3ab743ce;
        auVar158._12_4_ = 0x3ab743ce;
        auVar158._16_4_ = 0x3ab743ce;
        auVar158._20_4_ = 0x3ab743ce;
        auVar158._24_4_ = 0x3ab743ce;
        auVar158._28_4_ = 0x3ab743ce;
        auVar55 = vfmadd213ps_fma(auVar112,auVar116,auVar158);
        auVar159._8_4_ = 0x3c088908;
        auVar159._0_8_ = 0x3c0889083c088908;
        auVar159._12_4_ = 0x3c088908;
        auVar159._16_4_ = 0x3c088908;
        auVar159._20_4_ = 0x3c088908;
        auVar159._24_4_ = 0x3c088908;
        auVar159._28_4_ = 0x3c088908;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar116,auVar159);
        auVar160._8_4_ = 0x3d2aa9c1;
        auVar160._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar160._12_4_ = 0x3d2aa9c1;
        auVar160._16_4_ = 0x3d2aa9c1;
        auVar160._20_4_ = 0x3d2aa9c1;
        auVar160._24_4_ = 0x3d2aa9c1;
        auVar160._28_4_ = 0x3d2aa9c1;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar116,auVar160);
        auVar161._8_4_ = 0x3e2aaaaa;
        auVar161._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar161._12_4_ = 0x3e2aaaaa;
        auVar161._16_4_ = 0x3e2aaaaa;
        auVar161._20_4_ = 0x3e2aaaaa;
        auVar161._24_4_ = 0x3e2aaaaa;
        auVar161._28_4_ = 0x3e2aaaaa;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar56),auVar161);
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar56),auVar118);
        auVar63._0_4_ = fVar54 + 1.0;
        auVar63._4_4_ = fVar64 + 1.0;
        auVar63._8_4_ = fVar65 + 1.0;
        auVar63._12_4_ = fVar66 + 1.0;
        auVar63._16_4_ = 0x3f800000;
        auVar63._20_4_ = 0x3f800000;
        auVar63._24_4_ = 0x3f800000;
        auVar63._28_4_ = 0x3f800000;
        auVar55 = vfmadd231ps_fma(auVar63,auVar19,ZEXT1632(auVar55));
        auVar82._0_4_ = (int)auVar113._0_4_;
        auVar82._4_4_ = (int)auVar113._4_4_;
        auVar82._8_4_ = (int)auVar113._8_4_;
        auVar82._12_4_ = (int)auVar113._12_4_;
        auVar82._16_4_ = (int)auVar113._16_4_;
        auVar82._20_4_ = (int)auVar113._20_4_;
        auVar82._24_4_ = (int)auVar113._24_4_;
        auVar82._28_4_ = (int)auVar113._28_4_;
        auVar113 = vpslld_avx2(auVar82,0x17);
        auVar97._8_4_ = 0x3f800000;
        auVar97._0_8_ = 0x3f8000003f800000;
        auVar97._12_4_ = 0x3f800000;
        auVar97._16_4_ = 0x3f800000;
        auVar97._20_4_ = 0x3f800000;
        auVar97._24_4_ = 0x3f800000;
        auVar97._28_4_ = 0x3f800000;
        auVar113 = vpaddd_avx2(auVar113,auVar97);
        auVar55 = vfmadd213ps_fma(auVar113,ZEXT1632(auVar55),auVar135);
        auVar113 = vrcpps_avx(ZEXT1632(auVar55));
        auVar55 = vfmsub213ps_fma(ZEXT1632(auVar55),auVar113,auVar135);
        auVar55 = vfnmadd132ps_fma(ZEXT1632(auVar55),auVar113,auVar113);
        break;
      case 5:
        auVar165._8_4_ = 0x42b0c0a5;
        auVar165._0_8_ = 0x42b0c0a542b0c0a5;
        auVar165._12_4_ = 0x42b0c0a5;
        auVar165._16_4_ = 0x42b0c0a5;
        auVar165._20_4_ = 0x42b0c0a5;
        auVar165._24_4_ = 0x42b0c0a5;
        auVar165._28_4_ = 0x42b0c0a5;
        auVar113 = vminps_avx(auVar61,auVar165);
        auVar171._8_4_ = 0xc2b0c0a5;
        auVar171._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar171._12_4_ = 0xc2b0c0a5;
        auVar171._16_4_ = 0xc2b0c0a5;
        auVar171._20_4_ = 0xc2b0c0a5;
        auVar171._24_4_ = 0xc2b0c0a5;
        auVar171._28_4_ = 0xc2b0c0a5;
        auVar116 = vmaxps_avx(auVar171,auVar113);
        auVar55 = vfmadd213ps_fma(auVar175,auVar116,auVar177);
        auVar58 = vroundps_avx(ZEXT1632(auVar55),1);
        auVar113 = vcmpps_avx(ZEXT1632(auVar55),auVar58,1);
        auVar113 = vandps_avx(auVar179,auVar113);
        auVar113 = vsubps_avx(auVar58,auVar113);
        auVar166._8_4_ = 0x3f317218;
        auVar166._0_8_ = 0x3f3172183f317218;
        auVar166._12_4_ = 0x3f317218;
        auVar166._16_4_ = 0x3f317218;
        auVar166._20_4_ = 0x3f317218;
        auVar166._24_4_ = 0x3f317218;
        auVar166._28_4_ = 0x3f317218;
        auVar67 = vfnmadd231ps_fma(auVar116,auVar113,auVar166);
        auVar116 = ZEXT1632(auVar67);
        fVar65 = auVar67._0_4_;
        fVar66 = auVar67._4_4_;
        fVar100 = auVar67._8_4_;
        fVar9 = auVar67._12_4_;
        auVar15._28_4_ = auVar58._28_4_;
        auVar15._0_28_ =
             ZEXT1628(CONCAT412(fVar9 * fVar9,
                                CONCAT48(fVar100 * fVar100,CONCAT44(fVar66 * fVar66,fVar65 * fVar65)
                                        )));
        auVar55 = vfmadd213ps_fma(auVar184,auVar116,auVar186);
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar116,auVar188);
        auVar127._8_4_ = 0x3d2aa9c1;
        auVar127._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar127._12_4_ = 0x3d2aa9c1;
        auVar127._16_4_ = 0x3d2aa9c1;
        auVar127._20_4_ = 0x3d2aa9c1;
        auVar127._24_4_ = 0x3d2aa9c1;
        auVar127._28_4_ = 0x3d2aa9c1;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar116,auVar127);
        auVar128._8_4_ = 0x3e2aaaaa;
        auVar128._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar128._12_4_ = 0x3e2aaaaa;
        auVar128._16_4_ = 0x3e2aaaaa;
        auVar128._20_4_ = 0x3e2aaaaa;
        auVar128._24_4_ = 0x3e2aaaaa;
        auVar128._28_4_ = 0x3e2aaaaa;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar67),auVar128);
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar67),auVar177);
        auVar129._0_4_ = fVar65 + 1.0;
        auVar129._4_4_ = fVar66 + 1.0;
        auVar129._8_4_ = fVar100 + 1.0;
        auVar129._12_4_ = fVar9 + 1.0;
        auVar129._16_4_ = 0x3f800000;
        auVar129._20_4_ = 0x3f800000;
        auVar129._24_4_ = 0x3f800000;
        auVar129._28_4_ = 0x3f800000;
        auVar55 = vfmadd231ps_fma(auVar129,auVar15,ZEXT1632(auVar55));
        auVar76._0_4_ = (int)auVar113._0_4_;
        auVar76._4_4_ = (int)auVar113._4_4_;
        auVar76._8_4_ = (int)auVar113._8_4_;
        auVar76._12_4_ = (int)auVar113._12_4_;
        auVar76._16_4_ = (int)auVar113._16_4_;
        auVar76._20_4_ = (int)auVar113._20_4_;
        auVar76._24_4_ = (int)auVar113._24_4_;
        auVar76._28_4_ = (int)auVar113._28_4_;
        auVar113 = vpslld_avx2(auVar76,0x17);
        auVar77._8_4_ = 0x3f800000;
        auVar77._0_8_ = 0x3f8000003f800000;
        auVar77._12_4_ = 0x3f800000;
        auVar77._16_4_ = 0x3f800000;
        auVar77._20_4_ = 0x3f800000;
        auVar77._24_4_ = 0x3f800000;
        auVar77._28_4_ = 0x3f800000;
        auVar113 = vpaddd_avx2(auVar113,auVar77);
        auVar55 = vfmadd213ps_fma(auVar113,ZEXT1632(auVar55),auVar179);
        auVar107._8_4_ = 0x800000;
        auVar107._0_8_ = 0x80000000800000;
        auVar107._12_4_ = 0x800000;
        auVar107._16_4_ = 0x800000;
        auVar107._20_4_ = 0x800000;
        auVar107._24_4_ = 0x800000;
        auVar107._28_4_ = 0x800000;
        auVar113 = vmaxps_avx(ZEXT1632(auVar55),auVar107);
        auVar116 = vpsrld_avx2(auVar113,0x17);
        auVar130._8_4_ = 0x807fffff;
        auVar130._0_8_ = 0x807fffff807fffff;
        auVar130._12_4_ = 0x807fffff;
        auVar130._16_4_ = 0x807fffff;
        auVar130._20_4_ = 0x807fffff;
        auVar130._24_4_ = 0x807fffff;
        auVar130._28_4_ = 0x807fffff;
        auVar113 = vandps_avx(auVar113,auVar130);
        auVar131._8_4_ = 0x3f000000;
        auVar131._0_8_ = 0x3f0000003f000000;
        auVar131._12_4_ = 0x3f000000;
        auVar131._16_4_ = 0x3f000000;
        auVar131._20_4_ = 0x3f000000;
        auVar131._24_4_ = 0x3f000000;
        auVar131._28_4_ = 0x3f000000;
        auVar58 = vorps_avx(auVar113,auVar131);
        auVar132._8_4_ = 0xffffff82;
        auVar132._0_8_ = 0xffffff82ffffff82;
        auVar132._12_4_ = 0xffffff82;
        auVar132._16_4_ = 0xffffff82;
        auVar132._20_4_ = 0xffffff82;
        auVar132._24_4_ = 0xffffff82;
        auVar132._28_4_ = 0xffffff82;
        auVar10 = vpaddd_avx2(auVar116,auVar132);
        auVar133._8_4_ = 0x3f3504f3;
        auVar133._0_8_ = 0x3f3504f33f3504f3;
        auVar133._12_4_ = 0x3f3504f3;
        auVar133._16_4_ = 0x3f3504f3;
        auVar133._20_4_ = 0x3f3504f3;
        auVar133._24_4_ = 0x3f3504f3;
        auVar133._28_4_ = 0x3f3504f3;
        auVar116 = vcmpps_avx(auVar58,auVar133,1);
        auVar113 = vandps_avx(auVar116,auVar58);
        auVar172._8_4_ = 0xbf800000;
        auVar172._0_8_ = 0xbf800000bf800000;
        auVar172._12_4_ = 0xbf800000;
        auVar172._16_4_ = 0xbf800000;
        auVar172._20_4_ = 0xbf800000;
        auVar172._24_4_ = 0xbf800000;
        auVar172._28_4_ = 0xbf800000;
        auVar108._0_4_ = auVar58._0_4_ + -1.0 + auVar113._0_4_;
        auVar108._4_4_ = auVar58._4_4_ + -1.0 + auVar113._4_4_;
        auVar108._8_4_ = auVar58._8_4_ + -1.0 + auVar113._8_4_;
        auVar108._12_4_ = auVar58._12_4_ + -1.0 + auVar113._12_4_;
        auVar108._16_4_ = auVar58._16_4_ + -1.0 + auVar113._16_4_;
        auVar108._20_4_ = auVar58._20_4_ + -1.0 + auVar113._20_4_;
        auVar108._24_4_ = auVar58._24_4_ + -1.0 + auVar113._24_4_;
        auVar108._28_4_ = auVar58._28_4_ + -1.0 + auVar113._28_4_;
        auVar58 = vcmpps_avx(ZEXT1632(auVar55),(undefined1  [32])afVar181,2);
        auVar10 = vcvtdq2ps_avx(auVar10);
        auVar113 = vandps_avx(auVar179,auVar116);
        auVar113 = vsubps_avx(auVar10,auVar113);
        auVar134._8_4_ = 0x3d9021bb;
        auVar134._0_8_ = 0x3d9021bb3d9021bb;
        auVar134._12_4_ = 0x3d9021bb;
        auVar134._16_4_ = 0x3d9021bb;
        auVar134._20_4_ = 0x3d9021bb;
        auVar134._24_4_ = 0x3d9021bb;
        auVar134._28_4_ = 0x3d9021bb;
        auVar149._8_4_ = 0xbdebd1b8;
        auVar149._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar149._12_4_ = 0xbdebd1b8;
        auVar149._16_4_ = 0xbdebd1b8;
        auVar149._20_4_ = 0xbdebd1b8;
        auVar149._24_4_ = 0xbdebd1b8;
        auVar149._28_4_ = 0xbdebd1b8;
        auVar55 = vfmadd213ps_fma(auVar134,auVar108,auVar149);
        auVar150._8_4_ = 0x3def251a;
        auVar150._0_8_ = 0x3def251a3def251a;
        auVar150._12_4_ = 0x3def251a;
        auVar150._16_4_ = 0x3def251a;
        auVar150._20_4_ = 0x3def251a;
        auVar150._24_4_ = 0x3def251a;
        auVar150._28_4_ = 0x3def251a;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar108,auVar150);
        auVar151._8_4_ = 0xbdfe5d4f;
        auVar151._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar151._12_4_ = 0xbdfe5d4f;
        auVar151._16_4_ = 0xbdfe5d4f;
        auVar151._20_4_ = 0xbdfe5d4f;
        auVar151._24_4_ = 0xbdfe5d4f;
        auVar151._28_4_ = 0xbdfe5d4f;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar108,auVar151);
        auVar152._8_4_ = 0x3e11e9bf;
        auVar152._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar152._12_4_ = 0x3e11e9bf;
        auVar152._16_4_ = 0x3e11e9bf;
        auVar152._20_4_ = 0x3e11e9bf;
        auVar152._24_4_ = 0x3e11e9bf;
        auVar152._28_4_ = 0x3e11e9bf;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar108,auVar152);
        auVar153._8_4_ = 0xbe2aae50;
        auVar153._0_8_ = 0xbe2aae50be2aae50;
        auVar153._12_4_ = 0xbe2aae50;
        auVar153._16_4_ = 0xbe2aae50;
        auVar153._20_4_ = 0xbe2aae50;
        auVar153._24_4_ = 0xbe2aae50;
        auVar153._28_4_ = 0xbe2aae50;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar108,auVar153);
        auVar154._8_4_ = 0x3e4cceac;
        auVar154._0_8_ = 0x3e4cceac3e4cceac;
        auVar154._12_4_ = 0x3e4cceac;
        auVar154._16_4_ = 0x3e4cceac;
        auVar154._20_4_ = 0x3e4cceac;
        auVar154._24_4_ = 0x3e4cceac;
        auVar154._28_4_ = 0x3e4cceac;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar108,auVar154);
        auVar155._8_4_ = 0xbe7ffffc;
        auVar155._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar155._12_4_ = 0xbe7ffffc;
        auVar155._16_4_ = 0xbe7ffffc;
        auVar155._20_4_ = 0xbe7ffffc;
        auVar155._24_4_ = 0xbe7ffffc;
        auVar155._28_4_ = 0xbe7ffffc;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar108,auVar155);
        auVar156._8_4_ = 0x3eaaaaaa;
        auVar156._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar156._12_4_ = 0x3eaaaaaa;
        auVar156._16_4_ = 0x3eaaaaaa;
        auVar156._20_4_ = 0x3eaaaaaa;
        auVar156._24_4_ = 0x3eaaaaaa;
        auVar156._28_4_ = 0x3eaaaaaa;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar108,auVar156);
        auVar67 = vfmsub213ps_fma(ZEXT1632(auVar55),auVar108,auVar177);
        auVar55 = vfmadd213ps_fma(auVar113,auVar166,auVar108);
        auVar16._4_4_ = auVar108._4_4_ * auVar108._4_4_;
        auVar16._0_4_ = auVar108._0_4_ * auVar108._0_4_;
        auVar16._8_4_ = auVar108._8_4_ * auVar108._8_4_;
        auVar16._12_4_ = auVar108._12_4_ * auVar108._12_4_;
        auVar16._16_4_ = auVar108._16_4_ * auVar108._16_4_;
        auVar16._20_4_ = auVar108._20_4_ * auVar108._20_4_;
        auVar16._24_4_ = auVar108._24_4_ * auVar108._24_4_;
        auVar16._28_4_ = auVar108._28_4_;
        auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar16,ZEXT1632(auVar67));
        auVar157._8_4_ = 0xc0000000;
        auVar157._0_8_ = 0xc0000000c0000000;
        auVar157._12_4_ = 0xc0000000;
        auVar157._16_4_ = 0xc0000000;
        auVar157._20_4_ = 0xc0000000;
        auVar157._24_4_ = 0xc0000000;
        auVar157._28_4_ = 0xc0000000;
        auVar17._4_4_ = auVar55._4_4_ * -2.0;
        auVar17._0_4_ = auVar55._0_4_ * -2.0;
        auVar17._8_4_ = auVar55._8_4_ * -2.0;
        auVar17._12_4_ = auVar55._12_4_ * -2.0;
        auVar17._16_4_ = 0x80000000;
        auVar17._20_4_ = 0x80000000;
        auVar17._24_4_ = 0x80000000;
        auVar17._28_4_ = auVar108._28_4_;
        auVar117._8_4_ = 0x7fffffff;
        auVar117._0_8_ = 0x7fffffff7fffffff;
        auVar117._12_4_ = 0x7fffffff;
        auVar117._16_4_ = 0x7fffffff;
        auVar117._20_4_ = 0x7fffffff;
        auVar117._24_4_ = 0x7fffffff;
        auVar117._28_4_ = 0x7fffffff;
        auVar113 = vblendvps_avx(auVar17,auVar117,auVar58);
        auVar109._8_4_ = 0x42b0c0a5;
        auVar109._0_8_ = 0x42b0c0a542b0c0a5;
        auVar109._12_4_ = 0x42b0c0a5;
        auVar109._16_4_ = 0x42b0c0a5;
        auVar109._20_4_ = 0x42b0c0a5;
        auVar109._24_4_ = 0x42b0c0a5;
        auVar109._28_4_ = 0x42b0c0a5;
        auVar113 = vminps_avx(auVar113,auVar109);
        auVar110._8_4_ = 0xc2b0c0a5;
        auVar110._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar110._12_4_ = 0xc2b0c0a5;
        auVar110._16_4_ = 0xc2b0c0a5;
        auVar110._20_4_ = 0xc2b0c0a5;
        auVar110._24_4_ = 0xc2b0c0a5;
        auVar110._28_4_ = 0xc2b0c0a5;
        auVar116 = vmaxps_avx(auVar113,auVar110);
        auVar55 = vfmadd213ps_fma(auVar175,auVar116,auVar177);
        auVar58 = vroundps_avx(ZEXT1632(auVar55),1);
        auVar113 = vcmpps_avx(ZEXT1632(auVar55),auVar58,1);
        auVar113 = vandps_avx(auVar179,auVar113);
        auVar113 = vsubps_avx(auVar58,auVar113);
        auVar67 = vfnmadd231ps_fma(auVar116,auVar113,auVar166);
        auVar116 = ZEXT1632(auVar67);
        fVar65 = auVar67._0_4_;
        fVar66 = auVar67._4_4_;
        fVar100 = auVar67._8_4_;
        fVar9 = auVar67._12_4_;
        auVar18._28_4_ = auVar58._28_4_;
        auVar18._0_28_ =
             ZEXT1628(CONCAT412(fVar9 * fVar9,
                                CONCAT48(fVar100 * fVar100,CONCAT44(fVar66 * fVar66,fVar65 * fVar65)
                                        )));
        auVar55 = vfmadd213ps_fma(auVar184,auVar116,auVar186);
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar116,auVar188);
        auVar167._8_4_ = 0x3d2aa9c1;
        auVar167._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar167._12_4_ = 0x3d2aa9c1;
        auVar167._16_4_ = 0x3d2aa9c1;
        auVar167._20_4_ = 0x3d2aa9c1;
        auVar167._24_4_ = 0x3d2aa9c1;
        auVar167._28_4_ = 0x3d2aa9c1;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar116,auVar167);
        auVar168._8_4_ = 0x3e2aaaaa;
        auVar168._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar168._12_4_ = 0x3e2aaaaa;
        auVar168._16_4_ = 0x3e2aaaaa;
        auVar168._20_4_ = 0x3e2aaaaa;
        auVar168._24_4_ = 0x3e2aaaaa;
        auVar168._28_4_ = 0x3e2aaaaa;
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar67),auVar168);
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar67),auVar177);
        auVar94._0_4_ = fVar65 + 1.0;
        auVar94._4_4_ = fVar66 + 1.0;
        auVar94._8_4_ = fVar100 + 1.0;
        auVar94._12_4_ = fVar9 + 1.0;
        auVar94._16_4_ = 0x3f800000;
        auVar94._20_4_ = 0x3f800000;
        auVar94._24_4_ = 0x3f800000;
        auVar94._28_4_ = 0x3f800000;
        auVar55 = vfmadd231ps_fma(auVar94,auVar18,ZEXT1632(auVar55));
        auVar111._0_4_ = (int)auVar113._0_4_;
        auVar111._4_4_ = (int)auVar113._4_4_;
        auVar111._8_4_ = (int)auVar113._8_4_;
        auVar111._12_4_ = (int)auVar113._12_4_;
        auVar111._16_4_ = (int)auVar113._16_4_;
        auVar111._20_4_ = (int)auVar113._20_4_;
        auVar111._24_4_ = (int)auVar113._24_4_;
        auVar111._28_4_ = (int)auVar113._28_4_;
        auVar113 = vpslld_avx2(auVar111,0x17);
        auVar113 = vpaddd_avx2(auVar113,auVar77);
        auVar55 = vfmadd213ps_fma(auVar113,ZEXT1632(auVar55),auVar179);
        auVar113 = vrcpps_avx(ZEXT1632(auVar55));
        auVar55 = vfmsub213ps_fma(ZEXT1632(auVar55),auVar113,auVar179);
        auVar55 = vfnmadd132ps_fma(ZEXT1632(auVar55),auVar113,auVar113);
        auVar67 = vfnmadd213ps_fma(ZEXT1632(auVar55),auVar157,auVar172);
        goto LAB_001c81b3;
      case 6:
        uVar3 = **(undefined4 **)(p_Var31 + 0x40 + (long)&(this->weight_data_int8).data);
        auVar83._4_4_ = uVar3;
        auVar83._0_4_ = uVar3;
        auVar83._8_4_ = uVar3;
        auVar83._12_4_ = uVar3;
        auVar83._16_4_ = uVar3;
        auVar83._20_4_ = uVar3;
        auVar83._24_4_ = uVar3;
        auVar83._28_4_ = uVar3;
        uVar3 = (*(undefined4 **)(p_Var31 + 0x40 + (long)&(this->weight_data_int8).data))[1];
        auVar98._4_4_ = uVar3;
        auVar98._0_4_ = uVar3;
        auVar98._8_4_ = uVar3;
        auVar98._12_4_ = uVar3;
        auVar98._16_4_ = uVar3;
        auVar98._20_4_ = uVar3;
        auVar98._24_4_ = uVar3;
        auVar98._28_4_ = uVar3;
        auVar55 = vfmadd231ps_fma(auVar98,auVar61,auVar83);
        auVar113 = vmaxps_avx((undefined1  [32])afVar181,ZEXT1632(auVar55));
        auVar99._8_4_ = 0x3f800000;
        auVar99._0_8_ = 0x3f8000003f800000;
        auVar99._12_4_ = 0x3f800000;
        auVar99._16_4_ = 0x3f800000;
        auVar99._20_4_ = 0x3f800000;
        auVar99._24_4_ = 0x3f800000;
        auVar99._28_4_ = 0x3f800000;
        auVar113 = vminps_avx(auVar113,auVar99);
        auVar67 = auVar113._0_16_;
LAB_001c81b3:
        auVar55._0_4_ = auVar67._0_4_ * fVar54;
        auVar55._4_4_ = auVar67._4_4_ * fVar64;
        auVar55._8_4_ = auVar67._8_4_ * auVar56._8_4_;
        auVar55._12_4_ = auVar67._12_4_ * auVar56._12_4_;
      }
switchD_001c7e14_caseD_1:
      *(undefined1 (*) [16])((long)local_208 + uVar1 * 4) = auVar55;
    }
    local_1e8._8_4_ = 0x80000000;
    local_1e8._0_8_ = 0x8000000080000000;
    local_1e8._16_16_ = auVar88._16_16_;
    local_1e8._12_4_ = 0x80000000;
    iVar48 = 0;
    local_220 = this;
    local_218 = uVar49;
    for (lVar37 = (long)(int)((uVar28 & 0xfffffffc) + iVar35); p_Var31 = local_210[-3],
        lVar37 < *(int *)(p_Var31 + 0x28 + (long)&(this->weight_data_int8).data);
        lVar37 = lVar37 + 1) {
      if (*(int *)(p_Var31 + 0x2c + (long)&(this->weight_data_int8).data) == 0) {
        fVar54 = 0.0;
      }
      else {
        fVar54 = *(float *)(*(long *)(&this->field_0x178 + (long)p_Var31) + lVar37 * 4);
      }
      pauVar32 = (undefined1 (*) [16])((long)local_200 + lVar37 * local_1f0 * 2);
      auVar55 = ZEXT816(0) << 0x40;
      pauVar30 = (undefined1 (*) [32])bottom_blob_flattened.data;
      for (iVar35 = local_224; 0 < iVar35; iVar35 = iVar35 + -1) {
        auVar56 = vlddqu_avx(*pauVar32);
        auVar88 = vcvtph2ps_f16c(auVar56);
        auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar88,*pauVar30);
        pauVar30 = pauVar30 + 1;
        pauVar32 = pauVar32 + 1;
      }
      if ((int)local_218 != 0) {
        _m_f._0_16_ = ZEXT816(0);
        opt_flatten._0_16_ = ZEXT816(0);
        opt_flatten._0_32_ = ZEXT1632((undefined1  [16])opt_flatten._0_16_);
        for (uVar53 = 0; uVar49 != uVar53; uVar53 = uVar53 + 1) {
          local_108[uVar53 - 0x10] = *(undefined4 *)(*pauVar30 + uVar53 * 4);
          *(undefined2 *)((long)_m_f + uVar53 * 2) = *(undefined2 *)(*pauVar32 + uVar53 * 2);
        }
        auVar56 = vlddqu_avx(_m_f._0_16_);
        auVar88 = vcvtph2ps_f16c(auVar56);
        auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar88,(undefined1  [32])opt_flatten._0_32_);
      }
      auVar67._0_4_ = auVar55._0_4_ + 0.0;
      auVar67._4_4_ = auVar55._4_4_ + 0.0;
      auVar67._8_4_ = auVar55._8_4_ + 0.0;
      auVar67._12_4_ = auVar55._12_4_ + 0.0;
      auVar55 = vshufpd_avx(auVar67,auVar67,1);
      auVar68._0_4_ = auVar55._0_4_ + auVar67._0_4_;
      auVar68._4_4_ = auVar55._4_4_ + auVar67._4_4_;
      auVar68._8_4_ = auVar55._8_4_ + auVar67._8_4_;
      auVar68._12_4_ = auVar55._12_4_ + auVar67._12_4_;
      auVar55 = vmovshdup_avx(auVar68);
      fVar54 = auVar55._0_4_ + fVar54 + auVar68._0_4_;
      auVar55 = ZEXT416((uint)fVar54);
      fVar64 = fVar54;
      switch(*(undefined4 *)(p_Var31 + 0x38 + (long)&(this->weight_data_int8).data)) {
      case 1:
        auVar55 = vmaxss_avx(auVar55,ZEXT416(0));
        fVar64 = auVar55._0_4_;
        break;
      case 2:
        auVar57._0_12_ = ZEXT812(0);
        auVar57._12_4_ = 0;
        auVar55 = vcmpss_avx(auVar57,auVar55,1);
        auVar86._8_4_ = 0x3f800000;
        auVar86._0_8_ = 0x3f8000003f800000;
        auVar86._12_4_ = 0x3f800000;
        auVar55 = vblendvps_avx(ZEXT416(**(uint **)(p_Var31 + 0x40 +
                                                   (long)&(this->weight_data_int8).data)),auVar86,
                                auVar55);
        fVar64 = auVar55._0_4_ * fVar54;
        break;
      case 3:
        auVar55 = vmaxss_avx(auVar55,ZEXT416(**(uint **)(p_Var31 + 0x40 +
                                                        (long)&(this->weight_data_int8).data)));
        auVar55 = vminss_avx(auVar55,ZEXT416((*(uint **)(p_Var31 + 0x40 +
                                                        (long)&(this->weight_data_int8).data))[1]));
        fVar64 = auVar55._0_4_;
        break;
      case 4:
        uStack_240 = 0x1c8371;
        fVar54 = expf((float)((uint)fVar54 ^ local_1e8._0_4_));
        fVar64 = 1.0 / (fVar54 + 1.0);
        break;
      case 5:
        uStack_240 = 0x1c8325;
        fVar64 = expf(fVar54);
        uStack_240 = 0x1c8332;
        fVar64 = logf(fVar64 + 1.0);
        uStack_240 = 0x1c8337;
        fVar64 = tanhf(fVar64);
        fVar64 = fVar64 * fVar54;
        break;
      case 6:
        fVar65 = **(float **)(p_Var31 + 0x40 + (long)&(this->weight_data_int8).data);
        fVar66 = (*(float **)(p_Var31 + 0x40 + (long)&(this->weight_data_int8).data))[1];
        fVar100 = (float)((uint)fVar66 ^ local_1e8._0_4_) / fVar65;
        fVar64 = 0.0;
        if ((fVar100 <= fVar54) && (fVar64 = fVar54, fVar54 <= fVar100 + 1.0 / fVar65)) {
          auVar55 = vfmadd213ss_fma(ZEXT416((uint)fVar65),auVar55,ZEXT416((uint)fVar66));
          fVar64 = auVar55._0_4_ * fVar54;
        }
      }
      *(float *)((long)local_208 + lVar37 * 4) = fVar64;
    }
  }
  uStack_240 = 0x1c8422;
  Mat::~Mat(&bottom_blob_flattened);
  return iVar48;
}

Assistant:

int InnerProduct_x86_avx2::forward_fp16(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    // pack1
    {
        bottom_blob_flattened.w *= bottom_blob_flattened.elempack;
        bottom_blob_flattened.cstep = bottom_blob_flattened.w;
        bottom_blob_flattened.elemsize = 4u;
        bottom_blob_flattened.elempack = 1;
    }

    int w = bottom_blob_flattened.w;
    int h = bottom_blob_flattened.h;
    size_t elemsize = bottom_blob_flattened.elemsize;
    int size = w * h;
    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const unsigned short* weight_data_ptr = (const unsigned short*)weight_data_fp16;
    float* output_ptr = top_blob;
    int nn_num_output = num_output >> 3;
    int remain_num_output_start = nn_num_output << 3;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_num_output; pp++)
    {
        int p = pp * 8;

        float sums[8] = {0.0f};
        if (bias_term)
        {
            sums[0] = bias_data[p];
            sums[1] = bias_data[p + 1];
            sums[2] = bias_data[p + 2];
            sums[3] = bias_data[p + 3];
            sums[4] = bias_data[p + 4];
            sums[5] = bias_data[p + 5];
            sums[6] = bias_data[p + 6];
            sums[7] = bias_data[p + 7];
        }
        __m256 _sum0 = _mm256_set1_ps(0.f);
        __m256 _sum1 = _mm256_set1_ps(0.f);
        __m256 _sum2 = _mm256_set1_ps(0.f);
        __m256 _sum3 = _mm256_set1_ps(0.f);
        __m256 _sum4 = _mm256_set1_ps(0.f);
        __m256 _sum5 = _mm256_set1_ps(0.f);
        __m256 _sum6 = _mm256_set1_ps(0.f);
        __m256 _sum7 = _mm256_set1_ps(0.f);

        const unsigned short* w0 = (const unsigned short*)weight_data_ptr + size * p;
        const unsigned short* w1 = (const unsigned short*)weight_data_ptr + size * (p + 1);
        const unsigned short* w2 = (const unsigned short*)weight_data_ptr + size * (p + 2);
        const unsigned short* w3 = (const unsigned short*)weight_data_ptr + size * (p + 3);
        const unsigned short* w4 = (const unsigned short*)weight_data_ptr + size * (p + 4);
        const unsigned short* w5 = (const unsigned short*)weight_data_ptr + size * (p + 5);
        const unsigned short* w6 = (const unsigned short*)weight_data_ptr + size * (p + 6);
        const unsigned short* w7 = (const unsigned short*)weight_data_ptr + size * (p + 7);

        const float* m = bottom_blob_flattened;
        int nn = size >> 3;
        int remain = size & 7;

        for (; nn > 0; nn--)
        {
            __m256 _m = _mm256_loadu_ps(m);

            __m256 _w0 = loadfp16(w0);
            _sum0 = _mm256_comp_fmadd_ps(_m, _w0, _sum0);

            __m256 _w1 = loadfp16(w1);
            _sum1 = _mm256_comp_fmadd_ps(_m, _w1, _sum1);

            __m256 _w2 = loadfp16(w2);
            _sum2 = _mm256_comp_fmadd_ps(_m, _w2, _sum2);

            __m256 _w3 = loadfp16(w3);
            _sum3 = _mm256_comp_fmadd_ps(_m, _w3, _sum3);

            __m256 _w4 = loadfp16(w4);
            _sum4 = _mm256_comp_fmadd_ps(_m, _w4, _sum4);

            __m256 _w5 = loadfp16(w5);
            _sum5 = _mm256_comp_fmadd_ps(_m, _w5, _sum5);

            __m256 _w6 = loadfp16(w6);
            _sum6 = _mm256_comp_fmadd_ps(_m, _w6, _sum6);

            __m256 _w7 = loadfp16(w7);
            _sum7 = _mm256_comp_fmadd_ps(_m, _w7, _sum7);

            m += 8;
            w0 += 8;
            w1 += 8;
            w2 += 8;
            w3 += 8;
            w4 += 8;
            w5 += 8;
            w6 += 8;
            w7 += 8;
        }
        if (remain != 0)
        {
            unsigned short fp16_weights[8][8] = {{0}};
            float _m_f[8] = {0};
            int i = 0;
            // No fast way to convert to fp32 one element at the time
            // so batch an 8 lane vector.
            for (; remain > 0; remain--)
            {
                _m_f[i] = *m;
                fp16_weights[0][i] = *w0;
                fp16_weights[1][i] = *w1;
                fp16_weights[2][i] = *w2;
                fp16_weights[3][i] = *w3;
                fp16_weights[4][i] = *w4;
                fp16_weights[5][i] = *w5;
                fp16_weights[6][i] = *w6;
                fp16_weights[7][i] = *w7;
                i++;
                m++;
                w0++;
                w1++;
                w2++;
                w3++;
                w4++;
                w5++;
                w6++;
                w7++;
            }
            __m256 _m = _mm256_loadu_ps(_m_f);

            __m256 _w0 = loadfp16(fp16_weights[0]);
            _sum0 = _mm256_comp_fmadd_ps(_m, _w0, _sum0);

            __m256 _w1 = loadfp16(fp16_weights[1]);
            _sum1 = _mm256_comp_fmadd_ps(_m, _w1, _sum1);

            __m256 _w2 = loadfp16(fp16_weights[2]);
            _sum2 = _mm256_comp_fmadd_ps(_m, _w2, _sum2);

            __m256 _w3 = loadfp16(fp16_weights[3]);
            _sum3 = _mm256_comp_fmadd_ps(_m, _w3, _sum3);

            __m256 _w4 = loadfp16(fp16_weights[4]);
            _sum4 = _mm256_comp_fmadd_ps(_m, _w4, _sum4);

            __m256 _w5 = loadfp16(fp16_weights[5]);
            _sum5 = _mm256_comp_fmadd_ps(_m, _w5, _sum5);

            __m256 _w6 = loadfp16(fp16_weights[6]);
            _sum6 = _mm256_comp_fmadd_ps(_m, _w6, _sum6);

            __m256 _w7 = loadfp16(fp16_weights[7]);
            _sum7 = _mm256_comp_fmadd_ps(_m, _w7, _sum7);
        }

        __m256 _sums = HorizontalSums(_sum0, _sum1, _sum2, _sum3, _sum4, _sum5, _sum6, _sum7);
        __m256 _sums_f = _mm256_loadu_ps(sums);
        _sums = activation_avx(_mm256_add_ps(_sums_f, _sums), activation_type, activation_params);
        _mm256_storeu_ps(output_ptr + p, _sums);
    }

    nn_num_output = (num_output - remain_num_output_start) >> 2;
    int nn_offset = remain_num_output_start;
    remain_num_output_start += (nn_num_output << 2);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_num_output; pp++)
    {
        int p = nn_offset + (pp * 4);

        float sums[4] = {0.0f};
        if (bias_term)
        {
            sums[0] = bias_data[p];
            sums[1] = bias_data[p + 1];
            sums[2] = bias_data[p + 2];
            sums[3] = bias_data[p + 3];
        }
        __m256 _sum0 = _mm256_set1_ps(0.f);
        __m256 _sum1 = _mm256_set1_ps(0.f);
        __m256 _sum2 = _mm256_set1_ps(0.f);
        __m256 _sum3 = _mm256_set1_ps(0.f);

        const unsigned short* w0 = (const unsigned short*)weight_data_ptr + size * p;
        const unsigned short* w1 = (const unsigned short*)weight_data_ptr + size * (p + 1);
        const unsigned short* w2 = (const unsigned short*)weight_data_ptr + size * (p + 2);
        const unsigned short* w3 = (const unsigned short*)weight_data_ptr + size * (p + 3);

        const float* m = bottom_blob_flattened;
        int nn = size >> 3;
        int remain = size & 7;

        for (; nn > 0; nn--)
        {
            __m256 _m = _mm256_loadu_ps(m);

            __m256 _w0 = loadfp16(w0);
            _sum0 = _mm256_comp_fmadd_ps(_m, _w0, _sum0);

            __m256 _w1 = loadfp16(w1);
            _sum1 = _mm256_comp_fmadd_ps(_m, _w1, _sum1);

            __m256 _w2 = loadfp16(w2);
            _sum2 = _mm256_comp_fmadd_ps(_m, _w2, _sum2);

            __m256 _w3 = loadfp16(w3);
            _sum3 = _mm256_comp_fmadd_ps(_m, _w3, _sum3);

            m += 8;
            w0 += 8;
            w1 += 8;
            w2 += 8;
            w3 += 8;
        }
        if (remain != 0)
        {
            unsigned short fp16_weights[4][8] = {{0}};
            float _m_f[8] = {0};
            int i = 0;
            for (; remain > 0; remain--)
            {
                _m_f[i] = *m;
                fp16_weights[0][i] = *w0;
                fp16_weights[1][i] = *w1;
                fp16_weights[2][i] = *w2;
                fp16_weights[3][i] = *w3;
                i++;
                m++;
                w0++;
                w1++;
                w2++;
                w3++;
            }
            __m256 _m = _mm256_loadu_ps(_m_f);

            __m256 _w0 = loadfp16(fp16_weights[0]);
            _sum0 = _mm256_comp_fmadd_ps(_m, _w0, _sum0);

            __m256 _w1 = loadfp16(fp16_weights[1]);
            _sum1 = _mm256_comp_fmadd_ps(_m, _w1, _sum1);

            __m256 _w2 = loadfp16(fp16_weights[2]);
            _sum2 = _mm256_comp_fmadd_ps(_m, _w2, _sum2);

            __m256 _w3 = loadfp16(fp16_weights[3]);
            _sum3 = _mm256_comp_fmadd_ps(_m, _w3, _sum3);
        }

        __m128 _sums = HorizontalSums(_sum0, _sum1, _sum2, _sum3);
        __m256 _sums_a = activation_avx(_mm256_castps128_ps256(_mm_add_ps(_mm_loadu_ps(sums), _sums)), activation_type, activation_params);
        _mm_storeu_ps(output_ptr + p, _mm256_castps256_ps128(_sums_a));
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_num_output_start; p < num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        const unsigned short* w = (const unsigned short*)weight_data_ptr + size * p;

        __m256 _sum = _mm256_set1_ps(0.f);

        const float* m = bottom_blob_flattened;

        int nn = size >> 3;
        int remain = size & 7;
        for (; nn > 0; nn--)
        {
            __m256 _m = _mm256_loadu_ps(m);

            __m256 _w = loadfp16(w);
            _sum = _mm256_comp_fmadd_ps(_m, _w, _sum);

            m += 8;
            w += 8;
        }
        if (remain != 0)
        {
            unsigned short fp16_weights[8] = {0};
            float _m_f[8] = {0};
            int i = 0;
            for (; remain > 0; remain--)
            {
                _m_f[i] = *m;
                fp16_weights[i] = *w;
                i++;
                m++;
                w++;
            }
            __m256 _m = _mm256_loadu_ps(_m_f);

            __m256 _w = loadfp16(fp16_weights);
            _sum = _mm256_comp_fmadd_ps(_m, _w, _sum);
        }

        sum += _mm256_reduce_add_ps(_sum);
        sum = activation_ss(sum, activation_type, activation_params);

        output_ptr[p] = sum;
    }
    return 0;
}